

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_n<embree::avx2::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  uint uVar47;
  ulong uVar48;
  long lVar50;
  byte bVar51;
  uint uVar52;
  ulong uVar53;
  ulong uVar54;
  uint uVar55;
  ulong uVar56;
  undefined4 uVar57;
  undefined8 in_R9;
  bool bVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar86;
  vint4 bi_2;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar87;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined8 uVar88;
  vint4 bi_1;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar118;
  float fVar119;
  vint4 ai_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 ai;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  float fVar146;
  float fVar147;
  float fVar164;
  float fVar165;
  vint4 bi;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar166;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  vint4 ai_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  float fVar181;
  float fVar196;
  float fVar197;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vfloat4 a0_2;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  float fVar218;
  vfloat4 a0_3;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  vfloat4 a0_1;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar238;
  float fVar246;
  float fVar247;
  vfloat4 a0;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar248;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar268 [32];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_52c;
  undefined1 local_528 [8];
  undefined8 uStack_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined1 local_508 [16];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  ulong local_4d0;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_4b8 [8];
  float fStack_4b0;
  float fStack_4ac;
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [32];
  ulong local_3a8;
  Primitive *local_3a0;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 auStack_388 [16];
  undefined1 local_378 [32];
  RTCFilterFunctionNArguments local_358;
  uint local_328;
  uint uStack_324;
  uint uStack_320;
  uint uStack_31c;
  undefined1 local_318 [16];
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  uint auStack_2e8 [4];
  undefined8 local_2d8;
  undefined4 local_2d0;
  undefined8 local_2cc;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 auStack_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  uint uStack_1d8;
  float afStack_1d4 [7];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  undefined4 uStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  ulong uVar49;
  undefined1 auVar267 [32];
  
  PVar4 = prim[1];
  uVar48 = (ulong)(byte)PVar4;
  fVar59 = *(float *)(prim + uVar48 * 0x19 + 0x12);
  auVar12 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar48 * 0x19 + 6));
  auVar148._0_4_ = fVar59 * (ray->dir).field_0.m128[0];
  auVar148._4_4_ = fVar59 * (ray->dir).field_0.m128[1];
  auVar148._8_4_ = fVar59 * (ray->dir).field_0.m128[2];
  auVar148._12_4_ = fVar59 * (ray->dir).field_0.m128[3];
  auVar62._0_4_ = fVar59 * auVar12._0_4_;
  auVar62._4_4_ = fVar59 * auVar12._4_4_;
  auVar62._8_4_ = fVar59 * auVar12._8_4_;
  auVar62._12_4_ = fVar59 * auVar12._12_4_;
  auVar12 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 4 + 6)));
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 5 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar128 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 6 + 6)));
  auVar128 = vcvtdq2ps_avx(auVar128);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar239 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xc + 6)));
  auVar239 = vcvtdq2ps_avx(auVar239);
  auVar156 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0xd + 6)));
  auVar156 = vcvtdq2ps_avx(auVar156);
  auVar63 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x12 + 6)));
  auVar63 = vcvtdq2ps_avx(auVar63);
  auVar233 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x13 + 6)));
  auVar233 = vcvtdq2ps_avx(auVar233);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar48 * 0x14 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar256._4_4_ = auVar148._0_4_;
  auVar256._0_4_ = auVar148._0_4_;
  auVar256._8_4_ = auVar148._0_4_;
  auVar256._12_4_ = auVar148._0_4_;
  auVar90 = vshufps_avx(auVar148,auVar148,0x55);
  auVar125 = vshufps_avx(auVar148,auVar148,0xaa);
  fVar59 = auVar125._0_4_;
  auVar219._0_4_ = fVar59 * auVar128._0_4_;
  fVar86 = auVar125._4_4_;
  auVar219._4_4_ = fVar86 * auVar128._4_4_;
  fVar119 = auVar125._8_4_;
  auVar219._8_4_ = fVar119 * auVar128._8_4_;
  fVar87 = auVar125._12_4_;
  auVar219._12_4_ = fVar87 * auVar128._12_4_;
  auVar205._0_4_ = auVar156._0_4_ * fVar59;
  auVar205._4_4_ = auVar156._4_4_ * fVar86;
  auVar205._8_4_ = auVar156._8_4_ * fVar119;
  auVar205._12_4_ = auVar156._12_4_ * fVar87;
  auVar182._0_4_ = auVar107._0_4_ * fVar59;
  auVar182._4_4_ = auVar107._4_4_ * fVar86;
  auVar182._8_4_ = auVar107._8_4_ * fVar119;
  auVar182._12_4_ = auVar107._12_4_ * fVar87;
  auVar125 = vfmadd231ps_fma(auVar219,auVar90,auVar10);
  auVar91 = vfmadd231ps_fma(auVar205,auVar90,auVar239);
  auVar90 = vfmadd231ps_fma(auVar182,auVar233,auVar90);
  auVar92 = vfmadd231ps_fma(auVar125,auVar256,auVar12);
  auVar91 = vfmadd231ps_fma(auVar91,auVar256,auVar11);
  auVar135 = vfmadd231ps_fma(auVar90,auVar63,auVar256);
  auVar257._4_4_ = auVar62._0_4_;
  auVar257._0_4_ = auVar62._0_4_;
  auVar257._8_4_ = auVar62._0_4_;
  auVar257._12_4_ = auVar62._0_4_;
  auVar90 = vshufps_avx(auVar62,auVar62,0x55);
  auVar125 = vshufps_avx(auVar62,auVar62,0xaa);
  fVar59 = auVar125._0_4_;
  auVar149._0_4_ = fVar59 * auVar128._0_4_;
  fVar86 = auVar125._4_4_;
  auVar149._4_4_ = fVar86 * auVar128._4_4_;
  fVar119 = auVar125._8_4_;
  auVar149._8_4_ = fVar119 * auVar128._8_4_;
  fVar87 = auVar125._12_4_;
  auVar149._12_4_ = fVar87 * auVar128._12_4_;
  auVar89._0_4_ = auVar156._0_4_ * fVar59;
  auVar89._4_4_ = auVar156._4_4_ * fVar86;
  auVar89._8_4_ = auVar156._8_4_ * fVar119;
  auVar89._12_4_ = auVar156._12_4_ * fVar87;
  auVar125._0_4_ = auVar107._0_4_ * fVar59;
  auVar125._4_4_ = auVar107._4_4_ * fVar86;
  auVar125._8_4_ = auVar107._8_4_ * fVar119;
  auVar125._12_4_ = auVar107._12_4_ * fVar87;
  auVar10 = vfmadd231ps_fma(auVar149,auVar90,auVar10);
  auVar128 = vfmadd231ps_fma(auVar89,auVar90,auVar239);
  auVar239 = vfmadd231ps_fma(auVar125,auVar90,auVar233);
  auVar156 = vfmadd231ps_fma(auVar10,auVar257,auVar12);
  auVar233 = vfmadd231ps_fma(auVar128,auVar257,auVar11);
  auVar107 = vfmadd231ps_fma(auVar239,auVar257,auVar63);
  local_318._8_4_ = 0x7fffffff;
  local_318._0_8_ = 0x7fffffff7fffffff;
  local_318._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx(auVar92,local_318);
  auVar134._8_4_ = 0x219392ef;
  auVar134._0_8_ = 0x219392ef219392ef;
  auVar134._12_4_ = 0x219392ef;
  auVar12 = vcmpps_avx(auVar12,auVar134,1);
  auVar10 = vblendvps_avx(auVar92,auVar134,auVar12);
  auVar12 = vandps_avx(auVar91,local_318);
  auVar12 = vcmpps_avx(auVar12,auVar134,1);
  auVar128 = vblendvps_avx(auVar91,auVar134,auVar12);
  auVar12 = vandps_avx(local_318,auVar135);
  auVar12 = vcmpps_avx(auVar12,auVar134,1);
  auVar12 = vblendvps_avx(auVar135,auVar134,auVar12);
  auVar11 = vrcpps_avx(auVar10);
  auVar183._8_4_ = 0x3f800000;
  auVar183._0_8_ = 0x3f8000003f800000;
  auVar183._12_4_ = 0x3f800000;
  auVar10 = vfnmadd213ps_fma(auVar10,auVar11,auVar183);
  auVar11 = vfmadd132ps_fma(auVar10,auVar11,auVar11);
  auVar10 = vrcpps_avx(auVar128);
  auVar128 = vfnmadd213ps_fma(auVar128,auVar10,auVar183);
  auVar239 = vfmadd132ps_fma(auVar128,auVar10,auVar10);
  auVar10 = vrcpps_avx(auVar12);
  auVar12 = vfnmadd213ps_fma(auVar12,auVar10,auVar183);
  auVar63 = vfmadd132ps_fma(auVar12,auVar10,auVar10);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar48 * 7 + 6);
  auVar12 = vpmovsxwd_avx(auVar12);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar156);
  auVar135._0_4_ = auVar11._0_4_ * auVar12._0_4_;
  auVar135._4_4_ = auVar11._4_4_ * auVar12._4_4_;
  auVar135._8_4_ = auVar11._8_4_ * auVar12._8_4_;
  auVar135._12_4_ = auVar11._12_4_ * auVar12._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar48 * 9 + 6);
  auVar12 = vpmovsxwd_avx(auVar10);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar156);
  auVar150._0_4_ = auVar11._0_4_ * auVar12._0_4_;
  auVar150._4_4_ = auVar11._4_4_ * auVar12._4_4_;
  auVar150._8_4_ = auVar11._8_4_ * auVar12._8_4_;
  auVar150._12_4_ = auVar11._12_4_ * auVar12._12_4_;
  auVar128._8_8_ = 0;
  auVar128._0_8_ = *(ulong *)(prim + uVar48 * 0xe + 6);
  auVar12 = vpmovsxwd_avx(auVar128);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar233);
  auVar167._0_4_ = auVar239._0_4_ * auVar12._0_4_;
  auVar167._4_4_ = auVar239._4_4_ * auVar12._4_4_;
  auVar167._8_4_ = auVar239._8_4_ * auVar12._8_4_;
  auVar167._12_4_ = auVar239._12_4_ * auVar12._12_4_;
  auVar91._1_3_ = 0;
  auVar91[0] = PVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar12 = vpmovsxwd_avx(auVar11);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar233);
  auVar90._0_4_ = auVar239._0_4_ * auVar12._0_4_;
  auVar90._4_4_ = auVar239._4_4_ * auVar12._4_4_;
  auVar90._8_4_ = auVar239._8_4_ * auVar12._8_4_;
  auVar90._12_4_ = auVar239._12_4_ * auVar12._12_4_;
  auVar239._8_8_ = 0;
  auVar239._0_8_ = *(ulong *)(prim + uVar48 * 0x15 + 6);
  auVar12 = vpmovsxwd_avx(auVar239);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar107);
  auVar92._0_4_ = auVar63._0_4_ * auVar12._0_4_;
  auVar92._4_4_ = auVar63._4_4_ * auVar12._4_4_;
  auVar92._8_4_ = auVar63._8_4_ * auVar12._8_4_;
  auVar92._12_4_ = auVar63._12_4_ * auVar12._12_4_;
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar48 * 0x17 + 6);
  auVar12 = vpmovsxwd_avx(auVar156);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar12 = vsubps_avx(auVar12,auVar107);
  auVar233._0_4_ = auVar63._0_4_ * auVar12._0_4_;
  auVar233._4_4_ = auVar63._4_4_ * auVar12._4_4_;
  auVar233._8_4_ = auVar63._8_4_ * auVar12._8_4_;
  auVar233._12_4_ = auVar63._12_4_ * auVar12._12_4_;
  auVar12 = vpminsd_avx(auVar135,auVar150);
  auVar10 = vpminsd_avx(auVar167,auVar90);
  auVar12 = vmaxps_avx(auVar12,auVar10);
  auVar10 = vpminsd_avx(auVar92,auVar233);
  uVar57 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar206._4_4_ = uVar57;
  auVar206._0_4_ = uVar57;
  auVar206._8_4_ = uVar57;
  auVar206._12_4_ = uVar57;
  auVar10 = vmaxps_avx(auVar10,auVar206);
  auVar12 = vmaxps_avx(auVar12,auVar10);
  local_248._0_4_ = auVar12._0_4_ * 0.99999964;
  local_248._4_4_ = auVar12._4_4_ * 0.99999964;
  local_248._8_4_ = auVar12._8_4_ * 0.99999964;
  local_248._12_4_ = auVar12._12_4_ * 0.99999964;
  auVar12 = vpmaxsd_avx(auVar135,auVar150);
  auVar10 = vpmaxsd_avx(auVar167,auVar90);
  auVar12 = vminps_avx(auVar12,auVar10);
  auVar10 = vpmaxsd_avx(auVar92,auVar233);
  fVar59 = ray->tfar;
  auVar107._4_4_ = fVar59;
  auVar107._0_4_ = fVar59;
  auVar107._8_4_ = fVar59;
  auVar107._12_4_ = fVar59;
  auVar10 = vminps_avx(auVar10,auVar107);
  auVar12 = vminps_avx(auVar12,auVar10);
  auVar63._0_4_ = auVar12._0_4_ * 1.0000004;
  auVar63._4_4_ = auVar12._4_4_ * 1.0000004;
  auVar63._8_4_ = auVar12._8_4_ * 1.0000004;
  auVar63._12_4_ = auVar12._12_4_ * 1.0000004;
  auVar91[4] = PVar4;
  auVar91._5_3_ = 0;
  auVar91[8] = PVar4;
  auVar91._9_3_ = 0;
  auVar91[0xc] = PVar4;
  auVar91._13_3_ = 0;
  auVar10 = vpcmpgtd_avx(auVar91,_DAT_01f4ad30);
  auVar12 = vcmpps_avx(local_248,auVar63,2);
  auVar12 = vandps_avx(auVar12,auVar10);
  uVar57 = vmovmskps_avx(auVar12);
  uVar48 = CONCAT44((int)((ulong)in_R9 >> 0x20),uVar57);
  auVar83._16_16_ = mm_lookupmask_ps._240_16_;
  auVar83._0_16_ = mm_lookupmask_ps._240_16_;
  local_1b8 = vblendps_avx(auVar83,ZEXT832(0) << 0x20,0x80);
  local_3a0 = prim;
LAB_0112f8c6:
  if (uVar48 == 0) {
LAB_01131420:
    return uVar48 != 0;
  }
  lVar50 = 0;
  for (uVar54 = uVar48; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    lVar50 = lVar50 + 1;
  }
  local_4d0 = (ulong)*(uint *)(local_3a0 + 2);
  local_3a8 = (ulong)*(uint *)(local_3a0 + lVar50 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[local_4d0].ptr;
  uVar53 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_3a8);
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar156 = *(undefined1 (*) [16])(_Var8 + uVar53 * (long)pvVar7);
  auVar12 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 1) * (long)pvVar7);
  auVar10 = *(undefined1 (*) [16])(_Var8 + (uVar53 + 2) * (long)pvVar7);
  pfVar1 = (float *)(_Var8 + (long)pvVar7 * (uVar53 + 3));
  fVar59 = *pfVar1;
  fVar86 = pfVar1[1];
  fVar119 = pfVar1[2];
  fVar87 = pfVar1[3];
  lVar50 = *(long *)&pGVar5[1].time_range.upper;
  auVar128 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * uVar53);
  auVar11 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar53 + 1));
  auVar239 = *(undefined1 (*) [16])(lVar50 + (long)p_Var6 * (uVar53 + 2));
  uVar54 = uVar48 - 1 & uVar48;
  pfVar1 = (float *)(lVar50 + (long)p_Var6 * (uVar53 + 3));
  fVar60 = *pfVar1;
  fVar61 = pfVar1[1];
  fVar147 = pfVar1[2];
  fVar218 = pfVar1[3];
  if (uVar54 != 0) {
    uVar56 = uVar54 - 1 & uVar54;
    for (uVar53 = uVar54; (uVar53 & 1) == 0; uVar53 = uVar53 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar64._0_4_ = fVar60 * 0.0;
  auVar64._4_4_ = fVar61 * 0.0;
  auVar64._8_4_ = fVar147 * 0.0;
  auVar64._12_4_ = fVar218 * 0.0;
  auVar249._8_4_ = 0x3e2aaaab;
  auVar249._0_8_ = 0x3e2aaaab3e2aaaab;
  auVar249._12_4_ = 0x3e2aaaab;
  auVar63 = vfmadd213ps_fma(auVar249,auVar239,auVar64);
  auVar120._8_4_ = 0x3f2aaaab;
  auVar120._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar120._12_4_ = 0x3f2aaaab;
  auVar63 = vfmadd231ps_fma(auVar63,auVar11,auVar120);
  auVar233 = vfmadd231ps_fma(auVar63,auVar128,auVar249);
  auVar184._8_4_ = 0x3f000000;
  auVar184._0_8_ = 0x3f0000003f000000;
  auVar184._12_4_ = 0x3f000000;
  auVar63 = vfmadd231ps_fma(auVar64,auVar239,auVar184);
  auVar63 = vfnmadd231ps_fma(auVar63,auVar11,ZEXT816(0) << 0x40);
  auVar90 = vfnmadd231ps_fma(auVar63,auVar128,auVar184);
  auVar231._0_4_ = fVar59 * 0.0;
  auVar231._4_4_ = fVar86 * 0.0;
  auVar231._8_4_ = fVar119 * 0.0;
  auVar231._12_4_ = fVar87 * 0.0;
  auVar63 = vfmadd213ps_fma(auVar249,auVar10,auVar231);
  auVar63 = vfmadd231ps_fma(auVar63,auVar12,auVar120);
  auVar63 = vfmadd231ps_fma(auVar63,auVar156,auVar249);
  auVar107 = vfmadd231ps_fma(auVar231,auVar10,auVar184);
  auVar107 = vfnmadd231ps_fma(auVar107,auVar12,ZEXT816(0) << 0x40);
  auVar125 = vfnmadd231ps_fma(auVar107,auVar156,auVar184);
  auVar263._0_4_ = fVar60 * 0.16666667;
  auVar263._4_4_ = fVar61 * 0.16666667;
  auVar263._8_4_ = fVar147 * 0.16666667;
  auVar263._12_4_ = fVar218 * 0.16666667;
  auVar121._8_4_ = 0x3f2aaaab;
  auVar121._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar121._12_4_ = 0x3f2aaaab;
  auVar107 = vfmadd231ps_fma(auVar263,auVar239,auVar121);
  auVar107 = vfmadd231ps_fma(auVar107,auVar11,auVar249);
  auVar92 = ZEXT816(0) << 0x20;
  auVar107 = vfmadd231ps_fma(auVar107,auVar128,auVar92);
  auVar122._0_4_ = fVar60 * 0.5;
  auVar122._4_4_ = fVar61 * 0.5;
  auVar122._8_4_ = fVar147 * 0.5;
  auVar122._12_4_ = fVar218 * 0.5;
  auVar239 = vfmadd231ps_fma(auVar122,auVar92,auVar239);
  auVar11 = vfnmadd231ps_fma(auVar239,auVar184,auVar11);
  auVar91 = vfnmadd231ps_fma(auVar11,auVar92,auVar128);
  auVar198._0_4_ = fVar59 * 0.16666667;
  auVar198._4_4_ = fVar86 * 0.16666667;
  auVar198._8_4_ = fVar119 * 0.16666667;
  auVar198._12_4_ = fVar87 * 0.16666667;
  auVar207._8_4_ = 0x3f2aaaab;
  auVar207._0_8_ = 0x3f2aaaab3f2aaaab;
  auVar207._12_4_ = 0x3f2aaaab;
  auVar128 = vfmadd231ps_fma(auVar198,auVar10,auVar207);
  auVar128 = vfmadd231ps_fma(auVar128,auVar12,auVar249);
  auVar239 = vfmadd231ps_fma(auVar128,auVar156,auVar92);
  auVar208._0_4_ = fVar59 * 0.5;
  auVar208._4_4_ = fVar86 * 0.5;
  auVar208._8_4_ = fVar119 * 0.5;
  auVar208._12_4_ = fVar87 * 0.5;
  auVar10 = vfmadd231ps_fma(auVar208,auVar92,auVar10);
  auVar12 = vfnmadd231ps_fma(auVar10,auVar184,auVar12);
  auVar156 = vfnmadd231ps_fma(auVar12,auVar92,auVar156);
  auVar12 = vshufps_avx(auVar90,auVar90,0xc9);
  auVar10 = vshufps_avx(auVar63,auVar63,0xc9);
  fVar60 = auVar90._0_4_;
  auVar151._0_4_ = fVar60 * auVar10._0_4_;
  fVar61 = auVar90._4_4_;
  auVar151._4_4_ = fVar61 * auVar10._4_4_;
  fVar147 = auVar90._8_4_;
  auVar151._8_4_ = fVar147 * auVar10._8_4_;
  fVar218 = auVar90._12_4_;
  auVar151._12_4_ = fVar218 * auVar10._12_4_;
  auVar10 = vfmsub231ps_fma(auVar151,auVar12,auVar63);
  auVar128 = vshufps_avx(auVar10,auVar10,0xc9);
  auVar10 = vshufps_avx(auVar125,auVar125,0xc9);
  auVar152._0_4_ = fVar60 * auVar10._0_4_;
  auVar152._4_4_ = fVar61 * auVar10._4_4_;
  auVar152._8_4_ = fVar147 * auVar10._8_4_;
  auVar152._12_4_ = fVar218 * auVar10._12_4_;
  auVar12 = vfmsub231ps_fma(auVar152,auVar12,auVar125);
  auVar11 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar10 = vshufps_avx(auVar91,auVar91,0xc9);
  auVar12 = vshufps_avx(auVar239,auVar239,0xc9);
  fVar118 = auVar91._0_4_;
  auVar136._0_4_ = fVar118 * auVar12._0_4_;
  fVar181 = auVar91._4_4_;
  auVar136._4_4_ = fVar181 * auVar12._4_4_;
  fVar196 = auVar91._8_4_;
  auVar136._8_4_ = fVar196 * auVar12._8_4_;
  fVar197 = auVar91._12_4_;
  auVar136._12_4_ = fVar197 * auVar12._12_4_;
  auVar12 = vfmsub231ps_fma(auVar136,auVar10,auVar239);
  auVar239 = vshufps_avx(auVar12,auVar12,0xc9);
  auVar12 = vshufps_avx(auVar156,auVar156,0xc9);
  auVar168._0_4_ = fVar118 * auVar12._0_4_;
  auVar168._4_4_ = fVar181 * auVar12._4_4_;
  auVar168._8_4_ = fVar196 * auVar12._8_4_;
  auVar168._12_4_ = fVar197 * auVar12._12_4_;
  auVar12 = vdpps_avx(auVar128,auVar128,0x7f);
  auVar10 = vfmsub231ps_fma(auVar168,auVar10,auVar156);
  auVar156 = vshufps_avx(auVar10,auVar10,0xc9);
  fVar86 = auVar12._0_4_;
  auVar63 = ZEXT416((uint)fVar86);
  auVar10 = vrsqrtss_avx(auVar63,auVar63);
  fVar59 = auVar10._0_4_;
  fVar59 = fVar59 * 1.5 + fVar86 * -0.5 * fVar59 * fVar59 * fVar59;
  fVar146 = fVar59 * auVar128._0_4_;
  fVar164 = fVar59 * auVar128._4_4_;
  fVar165 = fVar59 * auVar128._8_4_;
  fVar166 = fVar59 * auVar128._12_4_;
  auVar10 = vdpps_avx(auVar128,auVar11,0x7f);
  auVar220._0_4_ = auVar11._0_4_ * fVar86;
  auVar220._4_4_ = auVar11._4_4_ * fVar86;
  auVar220._8_4_ = auVar11._8_4_ * fVar86;
  auVar220._12_4_ = auVar11._12_4_ * fVar86;
  fVar86 = auVar10._0_4_;
  auVar185._0_4_ = fVar86 * auVar128._0_4_;
  auVar185._4_4_ = fVar86 * auVar128._4_4_;
  auVar185._8_4_ = fVar86 * auVar128._8_4_;
  auVar185._12_4_ = fVar86 * auVar128._12_4_;
  auVar128 = vsubps_avx(auVar220,auVar185);
  auVar10 = vrcpss_avx(auVar63,auVar63);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar10,SUB6416(ZEXT464(0x40000000),0));
  fVar119 = auVar10._0_4_ * auVar12._0_4_;
  auVar12 = vdpps_avx(auVar239,auVar239,0x7f);
  fVar87 = auVar12._0_4_;
  auVar63 = ZEXT416((uint)fVar87);
  auVar10 = vrsqrtss_avx(auVar63,auVar63);
  fVar86 = auVar10._0_4_;
  fVar86 = fVar86 * 1.5 + fVar87 * -0.5 * fVar86 * fVar86 * fVar86;
  auVar10 = vdpps_avx(auVar239,auVar156,0x7f);
  fVar238 = fVar86 * auVar239._0_4_;
  fVar246 = fVar86 * auVar239._4_4_;
  fVar247 = fVar86 * auVar239._8_4_;
  fVar248 = fVar86 * auVar239._12_4_;
  auVar169._0_4_ = fVar87 * auVar156._0_4_;
  auVar169._4_4_ = fVar87 * auVar156._4_4_;
  auVar169._8_4_ = fVar87 * auVar156._8_4_;
  auVar169._12_4_ = fVar87 * auVar156._12_4_;
  fVar87 = auVar10._0_4_;
  auVar137._0_4_ = fVar87 * auVar239._0_4_;
  auVar137._4_4_ = fVar87 * auVar239._4_4_;
  auVar137._8_4_ = fVar87 * auVar239._8_4_;
  auVar137._12_4_ = fVar87 * auVar239._12_4_;
  auVar11 = vsubps_avx(auVar169,auVar137);
  auVar10 = vrcpss_avx(auVar63,auVar63);
  auVar12 = vfnmadd213ss_fma(auVar12,auVar10,ZEXT416(0x40000000));
  fVar87 = auVar12._0_4_ * auVar10._0_4_;
  auVar12 = vshufps_avx(auVar233,auVar233,0xff);
  auVar199._0_4_ = auVar12._0_4_ * fVar146;
  auVar199._4_4_ = auVar12._4_4_ * fVar164;
  auVar199._8_4_ = auVar12._8_4_ * fVar165;
  auVar199._12_4_ = auVar12._12_4_ * fVar166;
  local_458 = vsubps_avx(auVar233,auVar199);
  auVar10 = vshufps_avx(auVar90,auVar90,0xff);
  auVar153._0_4_ = auVar10._0_4_ * fVar146 + auVar12._0_4_ * fVar59 * fVar119 * auVar128._0_4_;
  auVar153._4_4_ = auVar10._4_4_ * fVar164 + auVar12._4_4_ * fVar59 * fVar119 * auVar128._4_4_;
  auVar153._8_4_ = auVar10._8_4_ * fVar165 + auVar12._8_4_ * fVar59 * fVar119 * auVar128._8_4_;
  auVar153._12_4_ = auVar10._12_4_ * fVar166 + auVar12._12_4_ * fVar59 * fVar119 * auVar128._12_4_;
  auVar128 = vsubps_avx(auVar90,auVar153);
  local_468._0_4_ = auVar199._0_4_ + auVar233._0_4_;
  local_468._4_4_ = auVar199._4_4_ + auVar233._4_4_;
  fStack_460 = auVar199._8_4_ + auVar233._8_4_;
  fStack_45c = auVar199._12_4_ + auVar233._12_4_;
  auVar12 = vshufps_avx(auVar107,auVar107,0xff);
  auVar93._0_4_ = fVar238 * auVar12._0_4_;
  auVar93._4_4_ = fVar246 * auVar12._4_4_;
  auVar93._8_4_ = fVar247 * auVar12._8_4_;
  auVar93._12_4_ = fVar248 * auVar12._12_4_;
  local_478 = vsubps_avx(auVar107,auVar93);
  auVar10 = vshufps_avx(auVar91,auVar91,0xff);
  auVar65._0_4_ = fVar238 * auVar10._0_4_ + auVar12._0_4_ * fVar86 * auVar11._0_4_ * fVar87;
  auVar65._4_4_ = fVar246 * auVar10._4_4_ + auVar12._4_4_ * fVar86 * auVar11._4_4_ * fVar87;
  auVar65._8_4_ = fVar247 * auVar10._8_4_ + auVar12._8_4_ * fVar86 * auVar11._8_4_ * fVar87;
  auVar65._12_4_ = fVar248 * auVar10._12_4_ + auVar12._12_4_ * fVar86 * auVar11._12_4_ * fVar87;
  auVar12 = vsubps_avx(auVar91,auVar65);
  local_4c8 = auVar107._0_4_ + auVar93._0_4_;
  fStack_4c4 = auVar107._4_4_ + auVar93._4_4_;
  fStack_4c0 = auVar107._8_4_ + auVar93._8_4_;
  fStack_4bc = auVar107._12_4_ + auVar93._12_4_;
  local_488._0_4_ = local_458._0_4_ + auVar128._0_4_ * 0.33333334;
  local_488._4_4_ = local_458._4_4_ + auVar128._4_4_ * 0.33333334;
  local_488._8_4_ = local_458._8_4_ + auVar128._8_4_ * 0.33333334;
  local_488._12_4_ = local_458._12_4_ + auVar128._12_4_ * 0.33333334;
  auVar66._0_4_ = auVar12._0_4_ * 0.33333334;
  auVar66._4_4_ = auVar12._4_4_ * 0.33333334;
  auVar66._8_4_ = auVar12._8_4_ * 0.33333334;
  auVar66._12_4_ = auVar12._12_4_ * 0.33333334;
  local_498 = vsubps_avx(local_478,auVar66);
  aVar2 = (ray->org).field_0;
  auVar128 = vsubps_avx(local_458,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar128,auVar128,0x55);
  auVar10 = vshufps_avx(auVar128,auVar128,0xaa);
  aVar3 = (pre->ray_space).vy.field_0;
  fVar59 = (pre->ray_space).vz.field_0.m128[0];
  fVar86 = (pre->ray_space).vz.field_0.m128[1];
  fVar119 = (pre->ray_space).vz.field_0.m128[2];
  fVar87 = (pre->ray_space).vz.field_0.m128[3];
  auVar138._0_4_ = fVar59 * auVar10._0_4_;
  auVar138._4_4_ = fVar86 * auVar10._4_4_;
  auVar138._8_4_ = fVar119 * auVar10._8_4_;
  auVar138._12_4_ = fVar87 * auVar10._12_4_;
  auVar90 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar3,auVar12);
  auVar11 = vsubps_avx(local_488,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar11,auVar11,0x55);
  auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
  auVar67._0_4_ = fVar59 * auVar10._0_4_;
  auVar67._4_4_ = fVar86 * auVar10._4_4_;
  auVar67._8_4_ = fVar119 * auVar10._8_4_;
  auVar67._12_4_ = fVar87 * auVar10._12_4_;
  auVar125 = vfmadd231ps_fma(auVar67,(undefined1  [16])aVar3,auVar12);
  auVar10 = vsubps_avx(local_498,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar10,auVar10,0xaa);
  auVar108._0_4_ = fVar59 * auVar12._0_4_;
  auVar108._4_4_ = fVar86 * auVar12._4_4_;
  auVar108._8_4_ = fVar119 * auVar12._8_4_;
  auVar108._12_4_ = fVar87 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar10,auVar10,0x55);
  auVar91 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar3,auVar12);
  auVar239 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar239,auVar239,0xaa);
  auVar123._0_4_ = fVar59 * auVar12._0_4_;
  auVar123._4_4_ = fVar86 * auVar12._4_4_;
  auVar123._8_4_ = fVar119 * auVar12._8_4_;
  auVar123._12_4_ = fVar87 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar239,auVar239,0x55);
  auVar92 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar12);
  auVar156 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar156,auVar156,0xaa);
  auVar94._0_4_ = fVar59 * auVar12._0_4_;
  auVar94._4_4_ = fVar86 * auVar12._4_4_;
  auVar94._8_4_ = fVar119 * auVar12._8_4_;
  auVar94._12_4_ = fVar87 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar156,auVar156,0x55);
  auVar135 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar12);
  local_4a8._0_4_ = (fVar60 + auVar153._0_4_) * 0.33333334 + (float)local_468._0_4_;
  local_4a8._4_4_ = (fVar61 + auVar153._4_4_) * 0.33333334 + (float)local_468._4_4_;
  fStack_4a0 = (fVar147 + auVar153._8_4_) * 0.33333334 + fStack_460;
  fStack_49c = (fVar218 + auVar153._12_4_) * 0.33333334 + fStack_45c;
  auVar63 = vsubps_avx(_local_4a8,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar63,auVar63,0xaa);
  auVar232._0_4_ = fVar59 * auVar12._0_4_;
  auVar232._4_4_ = fVar86 * auVar12._4_4_;
  auVar232._8_4_ = fVar119 * auVar12._8_4_;
  auVar232._12_4_ = fVar87 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar63,auVar63,0x55);
  auVar62 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar3,auVar12);
  auVar221._0_4_ = (fVar118 + auVar65._0_4_) * 0.33333334;
  auVar221._4_4_ = (fVar181 + auVar65._4_4_) * 0.33333334;
  auVar221._8_4_ = (fVar196 + auVar65._8_4_) * 0.33333334;
  auVar221._12_4_ = (fVar197 + auVar65._12_4_) * 0.33333334;
  auVar42._4_4_ = fStack_4c4;
  auVar42._0_4_ = local_4c8;
  auVar42._8_4_ = fStack_4c0;
  auVar42._12_4_ = fStack_4bc;
  _local_4b8 = vsubps_avx(auVar42,auVar221);
  auVar233 = vsubps_avx(_local_4b8,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar233,auVar233,0xaa);
  auVar222._0_4_ = fVar59 * auVar12._0_4_;
  auVar222._4_4_ = fVar86 * auVar12._4_4_;
  auVar222._8_4_ = fVar119 * auVar12._8_4_;
  auVar222._12_4_ = fVar87 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar233,auVar233,0x55);
  auVar89 = vfmadd231ps_fma(auVar222,(undefined1  [16])aVar3,auVar12);
  auVar107 = vsubps_avx(auVar42,(undefined1  [16])aVar2);
  auVar12 = vshufps_avx(auVar107,auVar107,0xaa);
  auVar186._0_4_ = fVar59 * auVar12._0_4_;
  auVar186._4_4_ = fVar86 * auVar12._4_4_;
  auVar186._8_4_ = fVar119 * auVar12._8_4_;
  auVar186._12_4_ = fVar87 * auVar12._12_4_;
  auVar12 = vshufps_avx(auVar107,auVar107,0x55);
  auVar12 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar3,auVar12);
  local_528._0_4_ = auVar128._0_4_;
  auVar170._4_4_ = local_528._0_4_;
  auVar170._0_4_ = local_528._0_4_;
  auVar170._8_4_ = local_528._0_4_;
  auVar170._12_4_ = local_528._0_4_;
  aVar3 = (pre->ray_space).vx.field_0;
  auVar90 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar170);
  local_4e8._0_4_ = auVar11._0_4_;
  auVar171._4_4_ = local_4e8._0_4_;
  auVar171._0_4_ = local_4e8._0_4_;
  auVar171._8_4_ = local_4e8._0_4_;
  auVar171._12_4_ = local_4e8._0_4_;
  auVar11 = vfmadd231ps_fma(auVar125,(undefined1  [16])aVar3,auVar171);
  uVar57 = auVar10._0_4_;
  auVar172._4_4_ = uVar57;
  auVar172._0_4_ = uVar57;
  auVar172._8_4_ = uVar57;
  auVar172._12_4_ = uVar57;
  auVar125 = vfmadd231ps_fma(auVar91,(undefined1  [16])aVar3,auVar172);
  uVar57 = auVar239._0_4_;
  auVar173._4_4_ = uVar57;
  auVar173._0_4_ = uVar57;
  auVar173._8_4_ = uVar57;
  auVar173._12_4_ = uVar57;
  auVar239 = vfmadd231ps_fma(auVar92,(undefined1  [16])aVar3,auVar173);
  uVar57 = auVar156._0_4_;
  auVar174._4_4_ = uVar57;
  auVar174._0_4_ = uVar57;
  auVar174._8_4_ = uVar57;
  auVar174._12_4_ = uVar57;
  auVar156 = vfmadd231ps_fma(auVar135,(undefined1  [16])aVar3,auVar174);
  uVar57 = auVar63._0_4_;
  auVar175._4_4_ = uVar57;
  auVar175._0_4_ = uVar57;
  auVar175._8_4_ = uVar57;
  auVar175._12_4_ = uVar57;
  auVar63 = vfmadd231ps_fma(auVar62,(undefined1  [16])aVar3,auVar175);
  uVar57 = auVar233._0_4_;
  auVar68._4_4_ = uVar57;
  auVar68._0_4_ = uVar57;
  auVar68._8_4_ = uVar57;
  auVar68._12_4_ = uVar57;
  auVar233 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar3,auVar68);
  uVar57 = auVar107._0_4_;
  auVar69._4_4_ = uVar57;
  auVar69._0_4_ = uVar57;
  auVar69._8_4_ = uVar57;
  auVar69._12_4_ = uVar57;
  auVar107 = vfmadd231ps_fma(auVar12,(undefined1  [16])aVar3,auVar69);
  local_4e8 = vmovlhps_avx(auVar90,auVar156);
  local_4f8 = vmovlhps_avx(auVar11,auVar63);
  local_508 = vmovlhps_avx(auVar125,auVar233);
  _local_218 = vmovlhps_avx(auVar239,auVar107);
  auVar12 = vminps_avx(local_4e8,local_4f8);
  auVar10 = vminps_avx(local_508,_local_218);
  auVar128 = vminps_avx(auVar12,auVar10);
  auVar12 = vmaxps_avx(local_4e8,local_4f8);
  auVar10 = vmaxps_avx(local_508,_local_218);
  auVar12 = vmaxps_avx(auVar12,auVar10);
  auVar10 = vshufpd_avx(auVar128,auVar128,3);
  auVar128 = vminps_avx(auVar128,auVar10);
  auVar10 = vshufpd_avx(auVar12,auVar12,3);
  auVar10 = vmaxps_avx(auVar12,auVar10);
  auVar12 = vandps_avx(local_318,auVar128);
  auVar10 = vandps_avx(local_318,auVar10);
  auVar12 = vmaxps_avx(auVar12,auVar10);
  auVar10 = vmovshdup_avx(auVar12);
  auVar12 = vmaxss_avx(auVar10,auVar12);
  local_78 = auVar12._0_4_ * 9.536743e-07;
  local_3d8._0_8_ = auVar90._0_8_;
  local_3d8._8_8_ = local_3d8._0_8_;
  local_3e8._0_8_ = auVar11._0_8_;
  local_3e8._8_8_ = local_3e8._0_8_;
  local_3f8._8_8_ = auVar125._0_8_;
  local_3f8._0_8_ = auVar125._0_8_;
  local_408._8_8_ = auVar239._0_8_;
  local_408._0_8_ = auVar239._0_8_;
  register0x00001388 = auVar156._0_8_;
  local_418 = auVar156._0_8_;
  local_428 = auVar63._0_8_;
  register0x000014c8 = local_428;
  local_438 = auVar233._0_8_;
  register0x00001488 = local_438;
  register0x000012c8 = auVar107._0_8_;
  local_448 = auVar107._0_8_;
  local_228 = ZEXT416((uint)local_78);
  local_328 = 0x80000000;
  uStack_324 = 0x80000000;
  uStack_320 = 0x80000000;
  uStack_31c = 0x80000000;
  fStack_74 = local_78;
  fStack_70 = local_78;
  fStack_6c = local_78;
  fStack_68 = local_78;
  fStack_64 = local_78;
  fStack_60 = local_78;
  fStack_5c = local_78;
  fStack_90 = -local_78;
  local_98 = -local_78;
  fStack_94 = -local_78;
  fStack_8c = fStack_90;
  fStack_88 = fStack_90;
  fStack_84 = fStack_90;
  fStack_80 = fStack_90;
  fStack_7c = fStack_90;
  bVar58 = false;
  uVar53 = 0;
  local_1e8 = vsubps_avx(local_4f8,local_4e8);
  local_1f8 = vsubps_avx(local_508,local_4f8);
  local_208 = vsubps_avx(_local_218,local_508);
  local_258 = vsubps_avx(_local_468,local_458);
  local_268 = vsubps_avx(_local_4a8,local_488);
  local_278 = vsubps_avx(_local_4b8,local_498);
  auVar43._4_4_ = fStack_4c4;
  auVar43._0_4_ = local_4c8;
  auVar43._8_4_ = fStack_4c0;
  auVar43._12_4_ = fStack_4bc;
  _local_288 = vsubps_avx(auVar43,local_478);
  auVar70 = ZEXT816(0x3f80000000000000);
  local_238 = auVar70;
LAB_01130055:
  auVar12 = vshufps_avx(auVar70,auVar70,0x50);
  auVar264._8_4_ = 0x3f800000;
  auVar264._0_8_ = 0x3f8000003f800000;
  auVar264._12_4_ = 0x3f800000;
  auVar267._16_4_ = 0x3f800000;
  auVar267._0_16_ = auVar264;
  auVar267._20_4_ = 0x3f800000;
  auVar267._24_4_ = 0x3f800000;
  auVar267._28_4_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar264,auVar12);
  fVar59 = auVar12._0_4_;
  auVar71._0_4_ = local_418._0_4_ * fVar59;
  fVar86 = auVar12._4_4_;
  auVar71._4_4_ = local_418._4_4_ * fVar86;
  fVar119 = auVar12._8_4_;
  auVar71._8_4_ = local_418._8_4_ * fVar119;
  fVar87 = auVar12._12_4_;
  auVar71._12_4_ = local_418._12_4_ * fVar87;
  auVar176._0_4_ = local_428._0_4_ * fVar59;
  auVar176._4_4_ = local_428._4_4_ * fVar86;
  auVar176._8_4_ = local_428._8_4_ * fVar119;
  auVar176._12_4_ = local_428._12_4_ * fVar87;
  auVar139._0_4_ = local_438._0_4_ * fVar59;
  auVar139._4_4_ = local_438._4_4_ * fVar86;
  auVar139._8_4_ = local_438._8_4_ * fVar119;
  auVar139._12_4_ = local_438._12_4_ * fVar87;
  auVar109._0_4_ = local_448._0_4_ * fVar59;
  auVar109._4_4_ = local_448._4_4_ * fVar86;
  auVar109._8_4_ = local_448._8_4_ * fVar119;
  auVar109._12_4_ = local_448._12_4_ * fVar87;
  auVar239 = vfmadd231ps_fma(auVar71,auVar10,local_3d8);
  auVar156 = vfmadd231ps_fma(auVar176,auVar10,local_3e8);
  auVar63 = vfmadd231ps_fma(auVar139,auVar10,local_3f8);
  auVar233 = vfmadd231ps_fma(auVar109,local_408,auVar10);
  auVar12 = vmovshdup_avx(local_238);
  fVar59 = local_238._0_4_;
  fStack_140 = (auVar12._0_4_ - fVar59) * 0.04761905;
  auVar216._4_4_ = fVar59;
  auVar216._0_4_ = fVar59;
  auVar216._8_4_ = fVar59;
  auVar216._12_4_ = fVar59;
  auVar216._16_4_ = fVar59;
  auVar216._20_4_ = fVar59;
  auVar216._24_4_ = fVar59;
  auVar216._28_4_ = fVar59;
  auVar104._0_8_ = auVar12._0_8_;
  auVar104._8_8_ = auVar104._0_8_;
  auVar104._16_8_ = auVar104._0_8_;
  auVar104._24_8_ = auVar104._0_8_;
  auVar83 = vsubps_avx(auVar104,auVar216);
  uVar57 = auVar239._0_4_;
  auVar261._4_4_ = uVar57;
  auVar261._0_4_ = uVar57;
  auVar261._8_4_ = uVar57;
  auVar261._12_4_ = uVar57;
  auVar261._16_4_ = uVar57;
  auVar261._20_4_ = uVar57;
  auVar261._24_4_ = uVar57;
  auVar261._28_4_ = uVar57;
  auVar12 = vmovshdup_avx(auVar239);
  uVar88 = auVar12._0_8_;
  auVar255._8_8_ = uVar88;
  auVar255._0_8_ = uVar88;
  auVar255._16_8_ = uVar88;
  auVar255._24_8_ = uVar88;
  fVar118 = auVar156._0_4_;
  auVar243._4_4_ = fVar118;
  auVar243._0_4_ = fVar118;
  auVar243._8_4_ = fVar118;
  auVar243._12_4_ = fVar118;
  auVar243._16_4_ = fVar118;
  auVar243._20_4_ = fVar118;
  auVar243._24_4_ = fVar118;
  auVar243._28_4_ = fVar118;
  auVar10 = vmovshdup_avx(auVar156);
  auVar105._0_8_ = auVar10._0_8_;
  auVar105._8_8_ = auVar105._0_8_;
  auVar105._16_8_ = auVar105._0_8_;
  auVar105._24_8_ = auVar105._0_8_;
  fVar218 = auVar63._0_4_;
  auVar193._4_4_ = fVar218;
  auVar193._0_4_ = fVar218;
  auVar193._8_4_ = fVar218;
  auVar193._12_4_ = fVar218;
  auVar193._16_4_ = fVar218;
  auVar193._20_4_ = fVar218;
  auVar193._24_4_ = fVar218;
  auVar193._28_4_ = fVar218;
  auVar128 = vmovshdup_avx(auVar63);
  auVar203._0_8_ = auVar128._0_8_;
  auVar203._8_8_ = auVar203._0_8_;
  auVar203._16_8_ = auVar203._0_8_;
  auVar203._24_8_ = auVar203._0_8_;
  fVar147 = auVar233._0_4_;
  auVar11 = vmovshdup_avx(auVar233);
  auVar107 = vfmadd132ps_fma(auVar83,auVar216,_DAT_01f7b040);
  auVar83 = vsubps_avx(auVar267,ZEXT1632(auVar107));
  fVar59 = auVar107._0_4_;
  fVar86 = auVar107._4_4_;
  auVar13._4_4_ = fVar118 * fVar86;
  auVar13._0_4_ = fVar118 * fVar59;
  fVar119 = auVar107._8_4_;
  auVar13._8_4_ = fVar118 * fVar119;
  fVar87 = auVar107._12_4_;
  auVar13._12_4_ = fVar118 * fVar87;
  auVar13._16_4_ = fVar118 * 0.0;
  auVar13._20_4_ = fVar118 * 0.0;
  auVar13._24_4_ = fVar118 * 0.0;
  auVar13._28_4_ = 0x3f800000;
  auVar107 = vfmadd231ps_fma(auVar13,auVar83,auVar261);
  fVar60 = auVar10._0_4_;
  fVar61 = auVar10._4_4_;
  auVar14._4_4_ = fVar61 * fVar86;
  auVar14._0_4_ = fVar60 * fVar59;
  auVar14._8_4_ = fVar60 * fVar119;
  auVar14._12_4_ = fVar61 * fVar87;
  auVar14._16_4_ = fVar60 * 0.0;
  auVar14._20_4_ = fVar61 * 0.0;
  auVar14._24_4_ = fVar60 * 0.0;
  auVar14._28_4_ = uVar57;
  auVar90 = vfmadd231ps_fma(auVar14,auVar83,auVar255);
  auVar15._4_4_ = fVar218 * fVar86;
  auVar15._0_4_ = fVar218 * fVar59;
  auVar15._8_4_ = fVar218 * fVar119;
  auVar15._12_4_ = fVar218 * fVar87;
  auVar15._16_4_ = fVar218 * 0.0;
  auVar15._20_4_ = fVar218 * 0.0;
  auVar15._24_4_ = fVar218 * 0.0;
  auVar15._28_4_ = auVar12._4_4_;
  auVar125 = vfmadd231ps_fma(auVar15,auVar83,auVar243);
  fVar60 = auVar128._0_4_;
  fVar61 = auVar128._4_4_;
  auVar9._4_4_ = fVar61 * fVar86;
  auVar9._0_4_ = fVar60 * fVar59;
  auVar9._8_4_ = fVar60 * fVar119;
  auVar9._12_4_ = fVar61 * fVar87;
  auVar9._16_4_ = fVar60 * 0.0;
  auVar9._20_4_ = fVar61 * 0.0;
  auVar9._24_4_ = fVar60 * 0.0;
  auVar9._28_4_ = fVar118;
  auVar91 = vfmadd231ps_fma(auVar9,auVar83,auVar105);
  auVar12 = vshufps_avx(auVar239,auVar239,0xaa);
  local_3c8._8_8_ = auVar12._0_8_;
  local_3c8._0_8_ = local_3c8._8_8_;
  local_3c8._16_8_ = local_3c8._8_8_;
  local_3c8._24_8_ = local_3c8._8_8_;
  auVar10 = vshufps_avx(auVar239,auVar239,0xff);
  uStack_520 = auVar10._0_8_;
  local_528 = (undefined1  [8])uStack_520;
  uStack_518 = uStack_520;
  uStack_510 = uStack_520;
  auVar245._4_4_ = fVar147 * fVar86;
  auVar245._0_4_ = fVar147 * fVar59;
  auVar245._8_4_ = fVar147 * fVar119;
  auVar245._12_4_ = fVar147 * fVar87;
  auVar245._16_4_ = fVar147 * 0.0;
  auVar245._20_4_ = fVar147 * 0.0;
  auVar245._24_4_ = fVar147 * 0.0;
  auVar245._28_4_ = fVar147;
  auVar239 = vfmadd231ps_fma(auVar245,auVar83,auVar193);
  auVar10 = vshufps_avx(auVar156,auVar156,0xaa);
  auVar194._0_8_ = auVar10._0_8_;
  auVar194._8_8_ = auVar194._0_8_;
  auVar194._16_8_ = auVar194._0_8_;
  auVar194._24_8_ = auVar194._0_8_;
  auVar128 = vshufps_avx(auVar156,auVar156,0xff);
  local_378._8_8_ = auVar128._0_8_;
  local_378._0_8_ = local_378._8_8_;
  local_378._16_8_ = local_378._8_8_;
  local_378._24_8_ = local_378._8_8_;
  fVar60 = auVar11._0_4_;
  fVar61 = auVar11._4_4_;
  auVar17._4_4_ = fVar61 * fVar86;
  auVar17._0_4_ = fVar60 * fVar59;
  auVar17._8_4_ = fVar60 * fVar119;
  auVar17._12_4_ = fVar61 * fVar87;
  auVar17._16_4_ = fVar60 * 0.0;
  auVar17._20_4_ = fVar61 * 0.0;
  auVar17._24_4_ = fVar60 * 0.0;
  auVar17._28_4_ = auVar12._4_4_;
  auVar92 = vfmadd231ps_fma(auVar17,auVar83,auVar203);
  auVar18._28_4_ = fVar61;
  auVar18._0_28_ =
       ZEXT1628(CONCAT412(auVar125._12_4_ * fVar87,
                          CONCAT48(auVar125._8_4_ * fVar119,
                                   CONCAT44(auVar125._4_4_ * fVar86,auVar125._0_4_ * fVar59))));
  auVar107 = vfmadd231ps_fma(auVar18,auVar83,ZEXT1632(auVar107));
  fVar60 = auVar128._4_4_;
  auVar19._28_4_ = fVar60;
  auVar19._0_28_ =
       ZEXT1628(CONCAT412(auVar91._12_4_ * fVar87,
                          CONCAT48(auVar91._8_4_ * fVar119,
                                   CONCAT44(auVar91._4_4_ * fVar86,auVar91._0_4_ * fVar59))));
  auVar90 = vfmadd231ps_fma(auVar19,auVar83,ZEXT1632(auVar90));
  auVar12 = vshufps_avx(auVar63,auVar63,0xaa);
  uVar88 = auVar12._0_8_;
  auVar180._8_8_ = uVar88;
  auVar180._0_8_ = uVar88;
  auVar180._16_8_ = uVar88;
  auVar180._24_8_ = uVar88;
  auVar11 = vshufps_avx(auVar63,auVar63,0xff);
  uVar88 = auVar11._0_8_;
  auVar268._8_8_ = uVar88;
  auVar268._0_8_ = uVar88;
  auVar268._16_8_ = uVar88;
  auVar268._24_8_ = uVar88;
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar239._12_4_ * fVar87,
                                               CONCAT48(auVar239._8_4_ * fVar119,
                                                        CONCAT44(auVar239._4_4_ * fVar86,
                                                                 auVar239._0_4_ * fVar59)))),auVar83
                            ,ZEXT1632(auVar125));
  auVar239 = vshufps_avx(auVar233,auVar233,0xaa);
  auVar156 = vshufps_avx(auVar233,auVar233,0xff);
  auVar233 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar92._12_4_,
                                                CONCAT48(fVar119 * auVar92._8_4_,
                                                         CONCAT44(fVar86 * auVar92._4_4_,
                                                                  fVar59 * auVar92._0_4_)))),auVar83
                             ,ZEXT1632(auVar91));
  auVar125 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar63._12_4_,
                                                CONCAT48(fVar119 * auVar63._8_4_,
                                                         CONCAT44(fVar86 * auVar63._4_4_,
                                                                  fVar59 * auVar63._0_4_)))),auVar83
                             ,ZEXT1632(auVar107));
  auVar13 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar107));
  auVar63 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar233._12_4_,
                                               CONCAT48(fVar119 * auVar233._8_4_,
                                                        CONCAT44(fVar86 * auVar233._4_4_,
                                                                 fVar59 * auVar233._0_4_)))),auVar83
                            ,ZEXT1632(auVar90));
  auVar14 = vsubps_avx(ZEXT1632(auVar233),ZEXT1632(auVar90));
  fVar61 = auVar14._28_4_;
  auVar244._0_4_ = fStack_140 * auVar13._0_4_ * 3.0;
  auVar244._4_4_ = fStack_140 * auVar13._4_4_ * 3.0;
  auVar244._8_4_ = fStack_140 * auVar13._8_4_ * 3.0;
  auVar244._12_4_ = fStack_140 * auVar13._12_4_ * 3.0;
  auVar244._16_4_ = fStack_140 * auVar13._16_4_ * 3.0;
  auVar244._20_4_ = fStack_140 * auVar13._20_4_ * 3.0;
  auVar244._24_4_ = fStack_140 * auVar13._24_4_ * 3.0;
  auVar244._28_4_ = 0;
  local_308._0_4_ = fStack_140 * auVar14._0_4_ * 3.0;
  local_308._4_4_ = fStack_140 * auVar14._4_4_ * 3.0;
  fStack_300 = fStack_140 * auVar14._8_4_ * 3.0;
  fStack_2fc = fStack_140 * auVar14._12_4_ * 3.0;
  fStack_2f8 = fStack_140 * auVar14._16_4_ * 3.0;
  fStack_2f4 = fStack_140 * auVar14._20_4_ * 3.0;
  fStack_2f0 = fStack_140 * auVar14._24_4_ * 3.0;
  fStack_2ec = fVar61;
  fVar147 = auVar10._0_4_;
  fVar218 = auVar10._4_4_;
  auVar20._4_4_ = fVar218 * fVar86;
  auVar20._0_4_ = fVar147 * fVar59;
  auVar20._8_4_ = fVar147 * fVar119;
  auVar20._12_4_ = fVar218 * fVar87;
  auVar20._16_4_ = fVar147 * 0.0;
  auVar20._20_4_ = fVar218 * 0.0;
  auVar20._24_4_ = fVar147 * 0.0;
  auVar20._28_4_ = fVar61;
  auVar10 = vfmadd231ps_fma(auVar20,auVar83,local_3c8);
  fVar147 = auVar128._0_4_;
  auVar21._4_4_ = fVar60 * fVar86;
  auVar21._0_4_ = fVar147 * fVar59;
  auVar21._8_4_ = fVar147 * fVar119;
  auVar21._12_4_ = fVar60 * fVar87;
  auVar21._16_4_ = fVar147 * 0.0;
  auVar21._20_4_ = fVar60 * 0.0;
  auVar21._24_4_ = fVar147 * 0.0;
  auVar21._28_4_ = 0;
  auVar128 = vfmadd231ps_fma(auVar21,auVar83,_local_528);
  fVar60 = auVar12._0_4_;
  fVar147 = auVar12._4_4_;
  auVar22._4_4_ = fVar147 * fVar86;
  auVar22._0_4_ = fVar60 * fVar59;
  auVar22._8_4_ = fVar60 * fVar119;
  auVar22._12_4_ = fVar147 * fVar87;
  auVar22._16_4_ = fVar60 * 0.0;
  auVar22._20_4_ = fVar147 * 0.0;
  auVar22._24_4_ = fVar60 * 0.0;
  auVar22._28_4_ = auVar13._28_4_;
  auVar12 = vfmadd231ps_fma(auVar22,auVar83,auVar194);
  fVar60 = auVar11._0_4_;
  fVar118 = auVar11._4_4_;
  auVar23._4_4_ = fVar118 * fVar86;
  auVar23._0_4_ = fVar60 * fVar59;
  auVar23._8_4_ = fVar60 * fVar119;
  auVar23._12_4_ = fVar118 * fVar87;
  auVar23._16_4_ = fVar60 * 0.0;
  auVar23._20_4_ = fVar118 * 0.0;
  auVar23._24_4_ = fVar60 * 0.0;
  auVar23._28_4_ = fVar218;
  auVar11 = vfmadd231ps_fma(auVar23,auVar83,local_378);
  local_378 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar125));
  fVar60 = auVar239._0_4_;
  fVar147 = auVar239._4_4_;
  auVar24._4_4_ = fVar147 * fVar86;
  auVar24._0_4_ = fVar60 * fVar59;
  auVar24._8_4_ = fVar60 * fVar119;
  auVar24._12_4_ = fVar147 * fVar87;
  auVar24._16_4_ = fVar60 * 0.0;
  auVar24._20_4_ = fVar147 * 0.0;
  auVar24._24_4_ = fVar60 * 0.0;
  auVar24._28_4_ = fVar147;
  auVar239 = vfmadd231ps_fma(auVar24,auVar83,auVar180);
  _local_528 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar63));
  fVar60 = auVar156._0_4_;
  fVar147 = auVar156._4_4_;
  auVar25._4_4_ = fVar147 * fVar86;
  auVar25._0_4_ = fVar60 * fVar59;
  auVar25._8_4_ = fVar60 * fVar119;
  auVar25._12_4_ = fVar147 * fVar87;
  auVar25._16_4_ = fVar60 * 0.0;
  auVar25._20_4_ = fVar147 * 0.0;
  auVar25._24_4_ = fVar60 * 0.0;
  auVar25._28_4_ = fVar147;
  auVar156 = vfmadd231ps_fma(auVar25,auVar83,auVar268);
  auVar26._28_4_ = fVar118;
  auVar26._0_28_ =
       ZEXT1628(CONCAT412(auVar12._12_4_ * fVar87,
                          CONCAT48(auVar12._8_4_ * fVar119,
                                   CONCAT44(auVar12._4_4_ * fVar86,auVar12._0_4_ * fVar59))));
  auVar10 = vfmadd231ps_fma(auVar26,auVar83,ZEXT1632(auVar10));
  auVar128 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar11._12_4_,
                                                CONCAT48(fVar119 * auVar11._8_4_,
                                                         CONCAT44(fVar86 * auVar11._4_4_,
                                                                  fVar59 * auVar11._0_4_)))),auVar83
                             ,ZEXT1632(auVar128));
  local_3c8._0_4_ = auVar125._0_4_ + auVar244._0_4_;
  local_3c8._4_4_ = auVar125._4_4_ + auVar244._4_4_;
  local_3c8._8_4_ = auVar125._8_4_ + auVar244._8_4_;
  local_3c8._12_4_ = auVar125._12_4_ + auVar244._12_4_;
  local_3c8._16_4_ = auVar244._16_4_ + 0.0;
  local_3c8._20_4_ = auVar244._20_4_ + 0.0;
  local_3c8._24_4_ = auVar244._24_4_ + 0.0;
  local_3c8._28_4_ = 0;
  auVar12 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar239._12_4_ * fVar87,
                                               CONCAT48(auVar239._8_4_ * fVar119,
                                                        CONCAT44(auVar239._4_4_ * fVar86,
                                                                 auVar239._0_4_ * fVar59)))),auVar83
                            ,ZEXT1632(auVar12));
  auVar11 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar156._12_4_ * fVar87,
                                               CONCAT48(auVar156._8_4_ * fVar119,
                                                        CONCAT44(auVar156._4_4_ * fVar86,
                                                                 auVar156._0_4_ * fVar59)))),auVar83
                            ,ZEXT1632(auVar11));
  auVar239 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar87 * auVar12._12_4_,
                                                CONCAT48(fVar119 * auVar12._8_4_,
                                                         CONCAT44(fVar86 * auVar12._4_4_,
                                                                  fVar59 * auVar12._0_4_)))),auVar83
                             ,ZEXT1632(auVar10));
  auVar156 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar11._12_4_ * fVar87,
                                                CONCAT48(auVar11._8_4_ * fVar119,
                                                         CONCAT44(auVar11._4_4_ * fVar86,
                                                                  auVar11._0_4_ * fVar59)))),
                             ZEXT1632(auVar128),auVar83);
  auVar83 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar10));
  auVar13 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar128));
  auVar262._0_4_ = fStack_140 * auVar83._0_4_ * 3.0;
  auVar262._4_4_ = fStack_140 * auVar83._4_4_ * 3.0;
  auVar262._8_4_ = fStack_140 * auVar83._8_4_ * 3.0;
  auVar262._12_4_ = fStack_140 * auVar83._12_4_ * 3.0;
  auVar262._16_4_ = fStack_140 * auVar83._16_4_ * 3.0;
  auVar262._20_4_ = fStack_140 * auVar83._20_4_ * 3.0;
  auVar262._24_4_ = fStack_140 * auVar83._24_4_ * 3.0;
  auVar262._28_4_ = 0;
  local_158 = fStack_140 * auVar13._0_4_ * 3.0;
  fStack_154 = fStack_140 * auVar13._4_4_ * 3.0;
  auVar27._4_4_ = fStack_154;
  auVar27._0_4_ = local_158;
  fStack_150 = fStack_140 * auVar13._8_4_ * 3.0;
  auVar27._8_4_ = fStack_150;
  fStack_14c = fStack_140 * auVar13._12_4_ * 3.0;
  auVar27._12_4_ = fStack_14c;
  fStack_148 = fStack_140 * auVar13._16_4_ * 3.0;
  auVar27._16_4_ = fStack_148;
  fStack_144 = fStack_140 * auVar13._20_4_ * 3.0;
  auVar27._20_4_ = fStack_144;
  fStack_140 = fStack_140 * auVar13._24_4_ * 3.0;
  auVar27._24_4_ = fStack_140;
  auVar27._28_4_ = 0x40400000;
  _local_398 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar239));
  _local_2a8 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar156));
  auVar83 = vsubps_avx(ZEXT1632(auVar239),ZEXT1632(auVar125));
  auVar13 = vsubps_avx(ZEXT1632(auVar156),ZEXT1632(auVar63));
  auVar14 = vsubps_avx(_local_398,local_378);
  fVar181 = auVar83._0_4_ + auVar14._0_4_;
  fVar196 = auVar83._4_4_ + auVar14._4_4_;
  fVar197 = auVar83._8_4_ + auVar14._8_4_;
  fVar146 = auVar83._12_4_ + auVar14._12_4_;
  fVar164 = auVar83._16_4_ + auVar14._16_4_;
  fVar165 = auVar83._20_4_ + auVar14._20_4_;
  fVar166 = auVar83._24_4_ + auVar14._24_4_;
  auVar15 = vsubps_avx(_local_2a8,_local_528);
  auVar84._0_4_ = auVar13._0_4_ + auVar15._0_4_;
  auVar84._4_4_ = auVar13._4_4_ + auVar15._4_4_;
  auVar84._8_4_ = auVar13._8_4_ + auVar15._8_4_;
  auVar84._12_4_ = auVar13._12_4_ + auVar15._12_4_;
  auVar84._16_4_ = auVar13._16_4_ + auVar15._16_4_;
  auVar84._20_4_ = auVar13._20_4_ + auVar15._20_4_;
  auVar84._24_4_ = auVar13._24_4_ + auVar15._24_4_;
  auVar84._28_4_ = auVar13._28_4_ + auVar15._28_4_;
  local_f8 = ZEXT1632(auVar63);
  fVar59 = auVar63._0_4_;
  local_178 = (float)local_308._0_4_ + fVar59;
  fVar86 = auVar63._4_4_;
  fStack_174 = (float)local_308._4_4_ + fVar86;
  fVar119 = auVar63._8_4_;
  fStack_170 = fStack_300 + fVar119;
  fVar87 = auVar63._12_4_;
  fStack_16c = fStack_2fc + fVar87;
  fStack_168 = fStack_2f8 + 0.0;
  fStack_164 = fStack_2f4 + 0.0;
  fStack_160 = fStack_2f0 + 0.0;
  local_b8 = ZEXT1632(auVar125);
  auVar13 = vsubps_avx(local_b8,auVar244);
  local_d8 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar13 = vsubps_avx(local_f8,_local_308);
  local_198 = vpermps_avx2(_DAT_01fb7720,auVar13);
  local_118._0_4_ = auVar239._0_4_ + auVar262._0_4_;
  local_118._4_4_ = auVar239._4_4_ + auVar262._4_4_;
  local_118._8_4_ = auVar239._8_4_ + auVar262._8_4_;
  local_118._12_4_ = auVar239._12_4_ + auVar262._12_4_;
  local_118._16_4_ = auVar262._16_4_ + 0.0;
  local_118._20_4_ = auVar262._20_4_ + 0.0;
  local_118._24_4_ = auVar262._24_4_ + 0.0;
  local_118._28_4_ = 0;
  auVar245 = ZEXT1632(auVar239);
  auVar13 = vsubps_avx(auVar245,auVar262);
  _local_308 = vpermps_avx2(_DAT_01fb7720,auVar13);
  fVar60 = auVar156._0_4_;
  local_158 = fVar60 + local_158;
  fVar147 = auVar156._4_4_;
  fStack_154 = fVar147 + fStack_154;
  fVar218 = auVar156._8_4_;
  fStack_150 = fVar218 + fStack_150;
  fVar118 = auVar156._12_4_;
  fStack_14c = fVar118 + fStack_14c;
  fStack_148 = fStack_148 + 0.0;
  fStack_144 = fStack_144 + 0.0;
  fStack_140 = fStack_140 + 0.0;
  auVar13 = vsubps_avx(ZEXT1632(auVar156),auVar27);
  local_138 = vpermps_avx2(_DAT_01fb7720,auVar13);
  auVar28._4_4_ = fVar86 * fVar196;
  auVar28._0_4_ = fVar59 * fVar181;
  auVar28._8_4_ = fVar119 * fVar197;
  auVar28._12_4_ = fVar87 * fVar146;
  auVar28._16_4_ = fVar164 * 0.0;
  auVar28._20_4_ = fVar165 * 0.0;
  auVar28._24_4_ = fVar166 * 0.0;
  auVar28._28_4_ = auVar13._28_4_;
  auVar12 = vfnmadd231ps_fma(auVar28,local_b8,auVar84);
  fStack_15c = fVar61 + 0.0;
  auVar29._4_4_ = fStack_174 * fVar196;
  auVar29._0_4_ = local_178 * fVar181;
  auVar29._8_4_ = fStack_170 * fVar197;
  auVar29._12_4_ = fStack_16c * fVar146;
  auVar29._16_4_ = fStack_168 * fVar164;
  auVar29._20_4_ = fStack_164 * fVar165;
  auVar29._24_4_ = fStack_160 * fVar166;
  auVar29._28_4_ = 0;
  auVar10 = vfnmadd231ps_fma(auVar29,auVar84,local_3c8);
  auVar30._4_4_ = local_198._4_4_ * fVar196;
  auVar30._0_4_ = local_198._0_4_ * fVar181;
  auVar30._8_4_ = local_198._8_4_ * fVar197;
  auVar30._12_4_ = local_198._12_4_ * fVar146;
  auVar30._16_4_ = local_198._16_4_ * fVar164;
  auVar30._20_4_ = local_198._20_4_ * fVar165;
  auVar30._24_4_ = local_198._24_4_ * fVar166;
  auVar30._28_4_ = fVar61 + 0.0;
  auVar128 = vfnmadd231ps_fma(auVar30,local_d8,auVar84);
  auVar31._4_4_ = (float)local_528._4_4_ * fVar196;
  auVar31._0_4_ = (float)local_528._0_4_ * fVar181;
  auVar31._8_4_ = (float)uStack_520 * fVar197;
  auVar31._12_4_ = uStack_520._4_4_ * fVar146;
  auVar31._16_4_ = (float)uStack_518 * fVar164;
  auVar31._20_4_ = uStack_518._4_4_ * fVar165;
  auVar31._24_4_ = (float)uStack_510 * fVar166;
  auVar31._28_4_ = uStack_510._4_4_;
  auVar11 = vfnmadd231ps_fma(auVar31,local_378,auVar84);
  auVar204._0_4_ = fVar60 * fVar181;
  auVar204._4_4_ = fVar147 * fVar196;
  auVar204._8_4_ = fVar218 * fVar197;
  auVar204._12_4_ = fVar118 * fVar146;
  auVar204._16_4_ = fVar164 * 0.0;
  auVar204._20_4_ = fVar165 * 0.0;
  auVar204._24_4_ = fVar166 * 0.0;
  auVar204._28_4_ = 0;
  auVar239 = vfnmadd231ps_fma(auVar204,auVar245,auVar84);
  uStack_13c = 0x40400000;
  auVar32._4_4_ = fStack_154 * fVar196;
  auVar32._0_4_ = local_158 * fVar181;
  auVar32._8_4_ = fStack_150 * fVar197;
  auVar32._12_4_ = fStack_14c * fVar146;
  auVar32._16_4_ = fStack_148 * fVar164;
  auVar32._20_4_ = fStack_144 * fVar165;
  auVar32._24_4_ = fStack_140 * fVar166;
  auVar32._28_4_ = local_378._28_4_;
  auVar63 = vfnmadd231ps_fma(auVar32,local_118,auVar84);
  auVar33._4_4_ = local_138._4_4_ * fVar196;
  auVar33._0_4_ = local_138._0_4_ * fVar181;
  auVar33._8_4_ = local_138._8_4_ * fVar197;
  auVar33._12_4_ = local_138._12_4_ * fVar146;
  auVar33._16_4_ = local_138._16_4_ * fVar164;
  auVar33._20_4_ = local_138._20_4_ * fVar165;
  auVar33._24_4_ = local_138._24_4_ * fVar166;
  auVar33._28_4_ = local_138._28_4_;
  auVar233 = vfnmadd231ps_fma(auVar33,_local_308,auVar84);
  auVar34._4_4_ = local_2a8._4_4_ * fVar196;
  auVar34._0_4_ = local_2a8._0_4_ * fVar181;
  auVar34._8_4_ = local_2a8._8_4_ * fVar197;
  auVar34._12_4_ = local_2a8._12_4_ * fVar146;
  auVar34._16_4_ = local_2a8._16_4_ * fVar164;
  auVar34._20_4_ = local_2a8._20_4_ * fVar165;
  auVar34._24_4_ = local_2a8._24_4_ * fVar166;
  auVar34._28_4_ = auVar83._28_4_ + auVar14._28_4_;
  auVar217 = ZEXT3264(_local_398);
  auVar107 = vfnmadd231ps_fma(auVar34,_local_398,auVar84);
  auVar13 = vminps_avx(ZEXT1632(auVar12),ZEXT1632(auVar10));
  auVar83 = vmaxps_avx(ZEXT1632(auVar12),ZEXT1632(auVar10));
  auVar14 = vminps_avx(ZEXT1632(auVar128),ZEXT1632(auVar11));
  auVar14 = vminps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(ZEXT1632(auVar128),ZEXT1632(auVar11));
  auVar83 = vmaxps_avx(auVar83,auVar13);
  auVar15 = vminps_avx(ZEXT1632(auVar239),ZEXT1632(auVar63));
  auVar13 = vmaxps_avx(ZEXT1632(auVar239),ZEXT1632(auVar63));
  auVar9 = vminps_avx(ZEXT1632(auVar233),ZEXT1632(auVar107));
  auVar15 = vminps_avx(auVar15,auVar9);
  auVar15 = vminps_avx(auVar14,auVar15);
  auVar14 = vmaxps_avx(ZEXT1632(auVar233),ZEXT1632(auVar107));
  auVar13 = vmaxps_avx(auVar13,auVar14);
  auVar13 = vmaxps_avx(auVar83,auVar13);
  auVar46._4_4_ = fStack_74;
  auVar46._0_4_ = local_78;
  auVar46._8_4_ = fStack_70;
  auVar46._12_4_ = fStack_6c;
  auVar46._16_4_ = fStack_68;
  auVar46._20_4_ = fStack_64;
  auVar46._24_4_ = fStack_60;
  auVar46._28_4_ = fStack_5c;
  auVar83 = vcmpps_avx(auVar15,auVar46,2);
  auVar45._4_4_ = fStack_94;
  auVar45._0_4_ = local_98;
  auVar45._8_4_ = fStack_90;
  auVar45._12_4_ = fStack_8c;
  auVar45._16_4_ = fStack_88;
  auVar45._20_4_ = fStack_84;
  auVar45._24_4_ = fStack_80;
  auVar45._28_4_ = fStack_7c;
  auVar13 = vcmpps_avx(auVar13,auVar45,5);
  auVar83 = vandps_avx(auVar13,auVar83);
  auVar13 = local_1b8 & auVar83;
  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar13 >> 0x7f,0) != '\0') ||
        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar13 >> 0xbf,0) != '\0') ||
      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar13[0x1f] < '\0') {
    auVar13 = vsubps_avx(local_378,local_b8);
    auVar14 = vsubps_avx(_local_398,auVar245);
    fVar181 = auVar13._0_4_ + auVar14._0_4_;
    fVar196 = auVar13._4_4_ + auVar14._4_4_;
    fVar197 = auVar13._8_4_ + auVar14._8_4_;
    fVar146 = auVar13._12_4_ + auVar14._12_4_;
    fVar164 = auVar13._16_4_ + auVar14._16_4_;
    fVar165 = auVar13._20_4_ + auVar14._20_4_;
    fVar166 = auVar13._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(_local_528,local_f8);
    auVar9 = vsubps_avx(_local_2a8,ZEXT1632(auVar156));
    auVar106._0_4_ = auVar15._0_4_ + auVar9._0_4_;
    auVar106._4_4_ = auVar15._4_4_ + auVar9._4_4_;
    auVar106._8_4_ = auVar15._8_4_ + auVar9._8_4_;
    auVar106._12_4_ = auVar15._12_4_ + auVar9._12_4_;
    auVar106._16_4_ = auVar15._16_4_ + auVar9._16_4_;
    auVar106._20_4_ = auVar15._20_4_ + auVar9._20_4_;
    auVar106._24_4_ = auVar15._24_4_ + auVar9._24_4_;
    fVar61 = auVar9._28_4_;
    auVar106._28_4_ = auVar15._28_4_ + fVar61;
    auVar35._4_4_ = fVar86 * fVar196;
    auVar35._0_4_ = fVar59 * fVar181;
    auVar35._8_4_ = fVar119 * fVar197;
    auVar35._12_4_ = fVar87 * fVar146;
    auVar35._16_4_ = fVar164 * 0.0;
    auVar35._20_4_ = fVar165 * 0.0;
    auVar35._24_4_ = fVar166 * 0.0;
    auVar35._28_4_ = local_2a8._28_4_;
    auVar239 = vfnmadd231ps_fma(auVar35,auVar106,local_b8);
    auVar36._4_4_ = fVar196 * fStack_174;
    auVar36._0_4_ = fVar181 * local_178;
    auVar36._8_4_ = fVar197 * fStack_170;
    auVar36._12_4_ = fVar146 * fStack_16c;
    auVar36._16_4_ = fVar164 * fStack_168;
    auVar36._20_4_ = fVar165 * fStack_164;
    auVar36._24_4_ = fVar166 * fStack_160;
    auVar36._28_4_ = 0;
    auVar12 = vfnmadd213ps_fma(local_3c8,auVar106,auVar36);
    auVar37._4_4_ = fVar196 * local_198._4_4_;
    auVar37._0_4_ = fVar181 * local_198._0_4_;
    auVar37._8_4_ = fVar197 * local_198._8_4_;
    auVar37._12_4_ = fVar146 * local_198._12_4_;
    auVar37._16_4_ = fVar164 * local_198._16_4_;
    auVar37._20_4_ = fVar165 * local_198._20_4_;
    auVar37._24_4_ = fVar166 * local_198._24_4_;
    auVar37._28_4_ = 0;
    auVar10 = vfnmadd213ps_fma(local_d8,auVar106,auVar37);
    auVar38._4_4_ = (float)local_528._4_4_ * fVar196;
    auVar38._0_4_ = (float)local_528._0_4_ * fVar181;
    auVar38._8_4_ = (float)uStack_520 * fVar197;
    auVar38._12_4_ = uStack_520._4_4_ * fVar146;
    auVar38._16_4_ = (float)uStack_518 * fVar164;
    auVar38._20_4_ = uStack_518._4_4_ * fVar165;
    auVar38._24_4_ = (float)uStack_510 * fVar166;
    auVar38._28_4_ = 0;
    auVar156 = vfnmadd231ps_fma(auVar38,auVar106,local_378);
    auVar132._0_4_ = fVar60 * fVar181;
    auVar132._4_4_ = fVar147 * fVar196;
    auVar132._8_4_ = fVar218 * fVar197;
    auVar132._12_4_ = fVar118 * fVar146;
    auVar132._16_4_ = fVar164 * 0.0;
    auVar132._20_4_ = fVar165 * 0.0;
    auVar132._24_4_ = fVar166 * 0.0;
    auVar132._28_4_ = 0;
    auVar63 = vfnmadd231ps_fma(auVar132,auVar106,auVar245);
    auVar39._4_4_ = fVar196 * fStack_154;
    auVar39._0_4_ = fVar181 * local_158;
    auVar39._8_4_ = fVar197 * fStack_150;
    auVar39._12_4_ = fVar146 * fStack_14c;
    auVar39._16_4_ = fVar164 * fStack_148;
    auVar39._20_4_ = fVar165 * fStack_144;
    auVar39._24_4_ = fVar166 * fStack_140;
    auVar39._28_4_ = fVar61;
    auVar128 = vfnmadd213ps_fma(local_118,auVar106,auVar39);
    auVar40._4_4_ = fVar196 * local_138._4_4_;
    auVar40._0_4_ = fVar181 * local_138._0_4_;
    auVar40._8_4_ = fVar197 * local_138._8_4_;
    auVar40._12_4_ = fVar146 * local_138._12_4_;
    auVar40._16_4_ = fVar164 * local_138._16_4_;
    auVar40._20_4_ = fVar165 * local_138._20_4_;
    auVar40._24_4_ = fVar166 * local_138._24_4_;
    auVar40._28_4_ = fVar61;
    auVar11 = vfnmadd213ps_fma(_local_308,auVar106,auVar40);
    auVar217 = ZEXT1664(auVar11);
    auVar41._4_4_ = fVar196 * local_2a8._4_4_;
    auVar41._0_4_ = fVar181 * local_2a8._0_4_;
    auVar41._8_4_ = fVar197 * local_2a8._8_4_;
    auVar41._12_4_ = fVar146 * local_2a8._12_4_;
    auVar41._16_4_ = fVar164 * local_2a8._16_4_;
    auVar41._20_4_ = fVar165 * local_2a8._20_4_;
    auVar41._24_4_ = fVar166 * local_2a8._24_4_;
    auVar41._28_4_ = auVar13._28_4_ + auVar14._28_4_;
    auVar233 = vfnmadd231ps_fma(auVar41,auVar106,_local_398);
    auVar14 = vminps_avx(ZEXT1632(auVar239),ZEXT1632(auVar12));
    auVar13 = vmaxps_avx(ZEXT1632(auVar239),ZEXT1632(auVar12));
    auVar15 = vminps_avx(ZEXT1632(auVar10),ZEXT1632(auVar156));
    auVar15 = vminps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar156));
    auVar13 = vmaxps_avx(auVar13,auVar14);
    auVar9 = vminps_avx(ZEXT1632(auVar63),ZEXT1632(auVar128));
    auVar14 = vmaxps_avx(ZEXT1632(auVar63),ZEXT1632(auVar128));
    auVar245 = vminps_avx(ZEXT1632(auVar11),ZEXT1632(auVar233));
    auVar9 = vminps_avx(auVar9,auVar245);
    auVar9 = vminps_avx(auVar15,auVar9);
    auVar15 = vmaxps_avx(ZEXT1632(auVar11),ZEXT1632(auVar233));
    auVar14 = vmaxps_avx(auVar14,auVar15);
    auVar14 = vmaxps_avx(auVar13,auVar14);
    auVar13 = vcmpps_avx(auVar9,auVar46,2);
    auVar14 = vcmpps_avx(auVar14,auVar45,5);
    auVar13 = vandps_avx(auVar14,auVar13);
    auVar83 = vandps_avx(auVar83,local_1b8);
    auVar14 = auVar83 & auVar13;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar83 = vandps_avx(auVar13,auVar83);
      uVar55 = vmovmskps_avx(auVar83);
      if (uVar55 != 0) {
        auStack_2e8[uVar53] = uVar55 & 0xff;
        uVar88 = vmovlps_avx(local_238);
        *(undefined8 *)(&uStack_1d8 + uVar53 * 2) = uVar88;
        uVar56 = vmovlps_avx(auVar70);
        auStack_58[uVar53] = uVar56;
        uVar53 = (ulong)((int)uVar53 + 1);
      }
    }
  }
LAB_01130604:
  if ((int)uVar53 != 0) {
    uVar47 = (int)uVar53 - 1;
    uVar49 = (ulong)uVar47;
    uVar52 = auStack_2e8[uVar49];
    uVar55 = (&uStack_1d8)[uVar49 * 2];
    fVar59 = afStack_1d4[uVar49 * 2];
    iVar16 = 0;
    for (uVar56 = (ulong)uVar52; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      iVar16 = iVar16 + 1;
    }
    uVar52 = uVar52 - 1 & uVar52;
    if (uVar52 == 0) {
      uVar53 = (ulong)uVar47;
    }
    auVar70._8_8_ = 0;
    auVar70._0_8_ = auStack_58[uVar49];
    auStack_2e8[uVar49] = uVar52;
    fVar86 = (float)(iVar16 + 1) * 0.14285715;
    auVar12 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * (float)iVar16 * 0.14285715)),ZEXT416(uVar55),
                              ZEXT416((uint)(1.0 - (float)iVar16 * 0.14285715)));
    auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar86)),ZEXT416(uVar55),
                              ZEXT416((uint)(1.0 - fVar86)));
    fVar86 = auVar10._0_4_;
    auVar195._0_4_ = auVar12._0_4_;
    fVar59 = fVar86 - auVar195._0_4_;
    if (fVar59 < 0.16666667) {
      auVar128 = vshufps_avx(auVar70,auVar70,0x50);
      auVar95._8_4_ = 0x3f800000;
      auVar95._0_8_ = 0x3f8000003f800000;
      auVar95._12_4_ = 0x3f800000;
      auVar11 = vsubps_avx(auVar95,auVar128);
      fVar119 = auVar128._0_4_;
      auVar140._0_4_ = fVar119 * (float)local_418._0_4_;
      fVar87 = auVar128._4_4_;
      auVar140._4_4_ = fVar87 * (float)local_418._4_4_;
      fVar60 = auVar128._8_4_;
      auVar140._8_4_ = fVar60 * fStack_410;
      fVar61 = auVar128._12_4_;
      auVar140._12_4_ = fVar61 * fStack_40c;
      auVar154._0_4_ = fVar119 * (float)local_428._0_4_;
      auVar154._4_4_ = fVar87 * (float)local_428._4_4_;
      auVar154._8_4_ = fVar60 * fStack_420;
      auVar154._12_4_ = fVar61 * fStack_41c;
      auVar177._0_4_ = fVar119 * (float)local_438._0_4_;
      auVar177._4_4_ = fVar87 * (float)local_438._4_4_;
      auVar177._8_4_ = fVar60 * fStack_430;
      auVar177._12_4_ = fVar61 * fStack_42c;
      auVar72._0_4_ = fVar119 * (float)local_448._0_4_;
      auVar72._4_4_ = fVar87 * (float)local_448._4_4_;
      auVar72._8_4_ = fVar60 * fStack_440;
      auVar72._12_4_ = fVar61 * fStack_43c;
      auVar128 = vfmadd231ps_fma(auVar140,auVar11,local_3d8);
      auVar239 = vfmadd231ps_fma(auVar154,auVar11,local_3e8);
      auVar156 = vfmadd231ps_fma(auVar177,auVar11,local_3f8);
      auVar11 = vfmadd231ps_fma(auVar72,auVar11,local_408);
      auVar133._16_16_ = auVar128;
      auVar133._0_16_ = auVar128;
      auVar145._16_16_ = auVar239;
      auVar145._0_16_ = auVar239;
      auVar163._16_16_ = auVar156;
      auVar163._0_16_ = auVar156;
      _local_528 = auVar12;
      auVar195._4_4_ = auVar195._0_4_;
      auVar195._8_4_ = auVar195._0_4_;
      auVar195._12_4_ = auVar195._0_4_;
      auVar195._20_4_ = fVar86;
      auVar195._16_4_ = fVar86;
      auVar195._24_4_ = fVar86;
      auVar195._28_4_ = fVar86;
      auVar83 = vsubps_avx(auVar145,auVar133);
      auVar239 = vfmadd213ps_fma(auVar83,auVar195,auVar133);
      auVar83 = vsubps_avx(auVar163,auVar145);
      auVar63 = vfmadd213ps_fma(auVar83,auVar195,auVar145);
      auVar128 = vsubps_avx(auVar11,auVar156);
      auVar85._16_16_ = auVar128;
      auVar85._0_16_ = auVar128;
      auVar128 = vfmadd213ps_fma(auVar85,auVar195,auVar163);
      auVar83 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar239));
      auVar11 = vfmadd213ps_fma(auVar83,auVar195,ZEXT1632(auVar239));
      auVar83 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar63));
      auVar128 = vfmadd213ps_fma(auVar83,auVar195,ZEXT1632(auVar63));
      auVar83 = vsubps_avx(ZEXT1632(auVar128),ZEXT1632(auVar11));
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar83,auVar195);
      fVar218 = auVar83._4_4_ * 3.0;
      local_378._0_4_ = fVar59;
      fVar119 = fVar59 * 0.33333334;
      auVar187._0_8_ =
           CONCAT44(auVar107._4_4_ + fVar119 * fVar218,
                    auVar107._0_4_ + fVar119 * auVar83._0_4_ * 3.0);
      auVar187._8_4_ = auVar107._8_4_ + fVar119 * auVar83._8_4_ * 3.0;
      auVar187._12_4_ = auVar107._12_4_ + fVar119 * auVar83._12_4_ * 3.0;
      _local_2a8 = vshufpd_avx(auVar107,auVar107,3);
      auVar11 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar128 = vsubps_avx(_local_2a8,auVar107);
      _local_398 = auVar11;
      auVar239 = vsubps_avx(auVar11,(undefined1  [16])0x0);
      auVar73._0_4_ = auVar128._0_4_ + auVar239._0_4_;
      auVar73._4_4_ = auVar128._4_4_ + auVar239._4_4_;
      auVar73._8_4_ = auVar128._8_4_ + auVar239._8_4_;
      auVar73._12_4_ = auVar128._12_4_ + auVar239._12_4_;
      auVar128 = vshufps_avx(auVar107,auVar107,0xb1);
      auVar239 = vshufps_avx(auVar187,auVar187,0xb1);
      auVar258._4_4_ = auVar73._0_4_;
      auVar258._0_4_ = auVar73._0_4_;
      auVar258._8_4_ = auVar73._0_4_;
      auVar258._12_4_ = auVar73._0_4_;
      auVar156 = vshufps_avx(auVar73,auVar73,0x55);
      fVar87 = auVar156._0_4_;
      auVar74._0_4_ = fVar87 * auVar128._0_4_;
      fVar60 = auVar156._4_4_;
      auVar74._4_4_ = fVar60 * auVar128._4_4_;
      fVar61 = auVar156._8_4_;
      auVar74._8_4_ = fVar61 * auVar128._8_4_;
      fVar147 = auVar156._12_4_;
      auVar74._12_4_ = fVar147 * auVar128._12_4_;
      auVar155._0_4_ = fVar87 * auVar239._0_4_;
      auVar155._4_4_ = fVar60 * auVar239._4_4_;
      auVar155._8_4_ = fVar61 * auVar239._8_4_;
      auVar155._12_4_ = fVar147 * auVar239._12_4_;
      auVar63 = vfmadd231ps_fma(auVar74,auVar258,auVar107);
      _local_308 = auVar187;
      auVar233 = vfmadd231ps_fma(auVar155,auVar258,auVar187);
      auVar239 = vshufps_avx(auVar63,auVar63,0xe8);
      auVar156 = vshufps_avx(auVar233,auVar233,0xe8);
      auVar128 = vcmpps_avx(auVar239,auVar156,1);
      uVar55 = vextractps_avx(auVar128,0);
      auVar90 = auVar233;
      if ((uVar55 & 1) == 0) {
        auVar90 = auVar63;
      }
      local_3c8._0_16_ = auVar10;
      auVar124._0_4_ = fVar119 * auVar83._16_4_ * 3.0;
      auVar124._4_4_ = fVar119 * fVar218;
      auVar124._8_4_ = fVar119 * auVar83._24_4_ * 3.0;
      auVar124._12_4_ = fVar119 * auVar217._28_4_;
      auVar135 = vsubps_avx((undefined1  [16])0x0,auVar124);
      auVar125 = vshufps_avx(auVar135,auVar135,0xb1);
      auVar91 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar188._0_4_ = fVar87 * auVar125._0_4_;
      auVar188._4_4_ = fVar60 * auVar125._4_4_;
      auVar188._8_4_ = fVar61 * auVar125._8_4_;
      auVar188._12_4_ = fVar147 * auVar125._12_4_;
      auVar200._0_4_ = auVar91._0_4_ * fVar87;
      auVar200._4_4_ = auVar91._4_4_ * fVar60;
      auVar200._8_4_ = auVar91._8_4_ * fVar61;
      auVar200._12_4_ = auVar91._12_4_ * fVar147;
      auVar62 = vfmadd231ps_fma(auVar188,auVar258,auVar135);
      auVar89 = vfmadd231ps_fma(auVar200,(undefined1  [16])0x0,auVar258);
      auVar91 = vshufps_avx(auVar62,auVar62,0xe8);
      auVar92 = vshufps_avx(auVar89,auVar89,0xe8);
      auVar217 = ZEXT1664(auVar92);
      auVar125 = vcmpps_avx(auVar91,auVar92,1);
      uVar55 = vextractps_avx(auVar125,0);
      auVar134 = auVar89;
      if ((uVar55 & 1) == 0) {
        auVar134 = auVar62;
      }
      auVar90 = vmaxss_avx(auVar134,auVar90);
      auVar239 = vminps_avx(auVar239,auVar156);
      auVar156 = vminps_avx(auVar91,auVar92);
      auVar156 = vminps_avx(auVar239,auVar156);
      auVar128 = vshufps_avx(auVar128,auVar128,0x55);
      auVar128 = vblendps_avx(auVar128,auVar125,2);
      auVar125 = vpslld_avx(auVar128,0x1f);
      auVar128 = vshufpd_avx(auVar233,auVar233,1);
      auVar128 = vinsertps_avx(auVar128,auVar89,0x9c);
      auVar239 = vshufpd_avx(auVar63,auVar63,1);
      auVar239 = vinsertps_avx(auVar239,auVar62,0x9c);
      auVar128 = vblendvps_avx(auVar239,auVar128,auVar125);
      auVar239 = vmovshdup_avx(auVar128);
      auVar128 = vmaxss_avx(auVar239,auVar128);
      fVar61 = auVar156._0_4_;
      auVar239 = vmovshdup_avx(auVar156);
      fVar60 = auVar128._0_4_;
      fVar119 = auVar239._0_4_;
      fVar87 = auVar90._0_4_;
      if (((0.0001 <= fVar61) || (fVar60 <= -0.0001)) && (0.0001 <= fVar119 || fVar60 <= -0.0001))
      goto code_r0x01130911;
      goto LAB_01130938;
    }
    local_238 = vinsertps_avx(auVar12,auVar10,0x10);
    goto LAB_01130055;
  }
  if (bVar58) goto LAB_01131420;
  fVar59 = ray->tfar;
  auVar82._4_4_ = fVar59;
  auVar82._0_4_ = fVar59;
  auVar82._8_4_ = fVar59;
  auVar82._12_4_ = fVar59;
  auVar12 = vcmpps_avx(local_248,auVar82,2);
  uVar55 = vmovmskps_avx(auVar12);
  uVar48 = (ulong)((uint)uVar54 & uVar55);
  goto LAB_0112f8c6;
code_r0x01130911:
  auVar239 = vcmpps_avx(auVar239,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar63 = vcmpps_avx(auVar156,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar239 = vandps_avx(auVar63,auVar239);
  if (fVar87 <= -0.0001 || (auVar239 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_01130604;
LAB_01130938:
  auVar63 = vcmpps_avx(auVar156,_DAT_01f45a50,1);
  auVar233 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar239 = vcmpss_avx(auVar90,ZEXT816(0) << 0x20,1);
  auVar96._8_4_ = 0x3f800000;
  auVar96._0_8_ = 0x3f8000003f800000;
  auVar96._12_4_ = 0x3f800000;
  auVar110._8_4_ = 0xbf800000;
  auVar110._0_8_ = 0xbf800000bf800000;
  auVar110._12_4_ = 0xbf800000;
  auVar239 = vblendvps_avx(auVar96,auVar110,auVar239);
  auVar63 = vblendvps_avx(auVar96,auVar110,auVar63);
  fVar218 = auVar63._0_4_;
  fVar147 = auVar239._0_4_;
  auVar239 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar218 == fVar147) && (!NAN(fVar218) && !NAN(fVar147))) {
    auVar239 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar218 == fVar147) && (!NAN(fVar218) && !NAN(fVar147))) {
    auVar233 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar63 = vmovshdup_avx(auVar63);
  fVar118 = auVar63._0_4_;
  if ((fVar218 != fVar118) || (NAN(fVar218) || NAN(fVar118))) {
    if ((fVar119 != fVar61) || (NAN(fVar119) || NAN(fVar61))) {
      auVar126._0_4_ = (float)((uint)fVar61 ^ local_328);
      auVar126._4_4_ = auVar156._4_4_ ^ uStack_324;
      auVar126._8_4_ = auVar156._8_4_ ^ uStack_320;
      auVar126._12_4_ = auVar156._12_4_ ^ uStack_31c;
      auVar127._0_4_ = auVar126._0_4_ / (fVar119 - fVar61);
      auVar127._4_12_ = auVar126._4_12_;
      auVar156 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar127._0_4_)),auVar127,ZEXT416(0));
      auVar63 = auVar156;
    }
    else {
      auVar156 = ZEXT816(0) << 0x20;
      if ((fVar61 != 0.0) || (auVar63 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar61))) {
        auVar156 = SUB6416(ZEXT464(0x7f800000),0);
        auVar63 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar239 = vminss_avx(auVar239,auVar156);
    auVar233 = vmaxss_avx(auVar63,auVar233);
  }
  auVar128 = vcmpss_avx(auVar128,ZEXT416(0),1);
  auVar97._8_4_ = 0x3f800000;
  auVar97._0_8_ = 0x3f8000003f800000;
  auVar97._12_4_ = 0x3f800000;
  auVar111._8_4_ = 0xbf800000;
  auVar111._0_8_ = 0xbf800000bf800000;
  auVar111._12_4_ = 0xbf800000;
  auVar128 = vblendvps_avx(auVar97,auVar111,auVar128);
  fVar119 = auVar128._0_4_;
  if ((fVar147 != fVar119) || (NAN(fVar147) || NAN(fVar119))) {
    if ((fVar60 != fVar87) || (NAN(fVar60) || NAN(fVar87))) {
      auVar75._0_4_ = (float)((uint)fVar87 ^ local_328);
      auVar75._4_4_ = auVar90._4_4_ ^ uStack_324;
      auVar75._8_4_ = auVar90._8_4_ ^ uStack_320;
      auVar75._12_4_ = auVar90._12_4_ ^ uStack_31c;
      auVar129._0_4_ = auVar75._0_4_ / (fVar60 - fVar87);
      auVar129._4_12_ = auVar75._4_12_;
      auVar128 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar129._0_4_)),auVar129,ZEXT416(0));
      auVar156 = auVar128;
    }
    else {
      auVar128 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar87 != 0.0) || (auVar156 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar87))) {
        auVar128 = SUB6416(ZEXT464(0xff800000),0);
        auVar156 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar239 = vminss_avx(auVar239,auVar156);
    auVar233 = vmaxss_avx(auVar128,auVar233);
  }
  if ((fVar118 != fVar119) || (NAN(fVar118) || NAN(fVar119))) {
    auVar239 = vminss_avx(auVar239,SUB6416(ZEXT464(0x3f800000),0));
    auVar233 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar233);
  }
  auVar128 = vmaxss_avx(ZEXT816(0) << 0x40,auVar239);
  auVar239 = vminss_avx(auVar233,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar239._0_4_ < auVar128._0_4_) goto LAB_01130604;
  auVar128 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar128._0_4_ + -0.1)));
  auVar239 = vminss_avx(ZEXT416((uint)(auVar239._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar141._0_8_ = auVar107._0_8_;
  auVar141._8_8_ = auVar141._0_8_;
  auVar209._8_8_ = auVar187._0_8_;
  auVar209._0_8_ = auVar187._0_8_;
  auVar223._8_8_ = auVar135._0_8_;
  auVar223._0_8_ = auVar135._0_8_;
  auVar156 = vshufpd_avx(auVar187,auVar187,3);
  auVar63 = vshufpd_avx(auVar135,auVar135,3);
  auVar233 = vshufps_avx(auVar128,auVar239,0);
  auVar76._8_4_ = 0x3f800000;
  auVar76._0_8_ = 0x3f8000003f800000;
  auVar76._12_4_ = 0x3f800000;
  auVar107 = vsubps_avx(auVar76,auVar233);
  fVar119 = auVar233._0_4_;
  auVar77._0_4_ = fVar119 * (float)local_2a8._0_4_;
  fVar87 = auVar233._4_4_;
  auVar77._4_4_ = fVar87 * (float)local_2a8._4_4_;
  fVar60 = auVar233._8_4_;
  auVar77._8_4_ = fVar60 * fStack_2a0;
  fVar61 = auVar233._12_4_;
  auVar77._12_4_ = fVar61 * fStack_29c;
  auVar178._0_4_ = fVar119 * auVar156._0_4_;
  auVar178._4_4_ = fVar87 * auVar156._4_4_;
  auVar178._8_4_ = fVar60 * auVar156._8_4_;
  auVar178._12_4_ = fVar61 * auVar156._12_4_;
  auVar189._0_4_ = fVar119 * auVar63._0_4_;
  auVar189._4_4_ = fVar87 * auVar63._4_4_;
  auVar189._8_4_ = fVar60 * auVar63._8_4_;
  auVar189._12_4_ = fVar61 * auVar63._12_4_;
  local_398._0_4_ = auVar11._0_4_;
  local_398._4_4_ = auVar11._4_4_;
  fStack_390 = auVar11._8_4_;
  fStack_38c = auVar11._12_4_;
  auVar201._0_4_ = fVar119 * (float)local_398._0_4_;
  auVar201._4_4_ = fVar87 * (float)local_398._4_4_;
  auVar201._8_4_ = fVar60 * fStack_390;
  auVar201._12_4_ = fVar61 * fStack_38c;
  auVar63 = vfmadd231ps_fma(auVar77,auVar107,auVar141);
  auVar233 = vfmadd231ps_fma(auVar178,auVar107,auVar209);
  auVar90 = vfmadd231ps_fma(auVar189,auVar107,auVar223);
  auVar107 = vfmadd231ps_fma(auVar201,auVar107,ZEXT816(0));
  auVar11 = vmovshdup_avx(auVar70);
  auVar62 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar128._0_4_)),auVar70,
                            ZEXT416((uint)(1.0 - auVar128._0_4_)));
  auVar89 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * auVar239._0_4_)),auVar70,
                            ZEXT416((uint)(1.0 - auVar239._0_4_)));
  fVar119 = 1.0 / fVar59;
  auVar128 = vsubps_avx(auVar233,auVar63);
  auVar210._0_4_ = auVar128._0_4_ * 3.0;
  auVar210._4_4_ = auVar128._4_4_ * 3.0;
  auVar210._8_4_ = auVar128._8_4_ * 3.0;
  auVar210._12_4_ = auVar128._12_4_ * 3.0;
  auVar128 = vsubps_avx(auVar90,auVar233);
  auVar224._0_4_ = auVar128._0_4_ * 3.0;
  auVar224._4_4_ = auVar128._4_4_ * 3.0;
  auVar224._8_4_ = auVar128._8_4_ * 3.0;
  auVar224._12_4_ = auVar128._12_4_ * 3.0;
  auVar128 = vsubps_avx(auVar107,auVar90);
  auVar234._0_4_ = auVar128._0_4_ * 3.0;
  auVar234._4_4_ = auVar128._4_4_ * 3.0;
  auVar234._8_4_ = auVar128._8_4_ * 3.0;
  auVar234._12_4_ = auVar128._12_4_ * 3.0;
  auVar11 = vminps_avx(auVar224,auVar234);
  auVar128 = vmaxps_avx(auVar224,auVar234);
  auVar11 = vminps_avx(auVar210,auVar11);
  auVar128 = vmaxps_avx(auVar210,auVar128);
  auVar239 = vshufpd_avx(auVar11,auVar11,3);
  auVar156 = vshufpd_avx(auVar128,auVar128,3);
  auVar11 = vminps_avx(auVar11,auVar239);
  auVar128 = vmaxps_avx(auVar128,auVar156);
  auVar225._0_4_ = auVar11._0_4_ * fVar119;
  auVar225._4_4_ = auVar11._4_4_ * fVar119;
  auVar225._8_4_ = auVar11._8_4_ * fVar119;
  auVar225._12_4_ = auVar11._12_4_ * fVar119;
  auVar211._0_4_ = auVar128._0_4_ * fVar119;
  auVar211._4_4_ = auVar128._4_4_ * fVar119;
  auVar211._8_4_ = auVar128._8_4_ * fVar119;
  auVar211._12_4_ = auVar128._12_4_ * fVar119;
  fVar119 = 1.0 / (auVar89._0_4_ - auVar62._0_4_);
  auVar128 = vshufpd_avx(auVar63,auVar63,3);
  auVar11 = vshufpd_avx(auVar233,auVar233,3);
  auVar239 = vshufpd_avx(auVar90,auVar90,3);
  auVar156 = vshufpd_avx(auVar107,auVar107,3);
  auVar128 = vsubps_avx(auVar128,auVar63);
  auVar63 = vsubps_avx(auVar11,auVar233);
  auVar233 = vsubps_avx(auVar239,auVar90);
  auVar156 = vsubps_avx(auVar156,auVar107);
  auVar11 = vminps_avx(auVar128,auVar63);
  auVar128 = vmaxps_avx(auVar128,auVar63);
  auVar239 = vminps_avx(auVar233,auVar156);
  auVar239 = vminps_avx(auVar11,auVar239);
  auVar11 = vmaxps_avx(auVar233,auVar156);
  auVar128 = vmaxps_avx(auVar128,auVar11);
  auVar250._0_4_ = fVar119 * auVar239._0_4_;
  auVar250._4_4_ = fVar119 * auVar239._4_4_;
  auVar250._8_4_ = fVar119 * auVar239._8_4_;
  auVar250._12_4_ = fVar119 * auVar239._12_4_;
  auVar240._0_4_ = fVar119 * auVar128._0_4_;
  auVar240._4_4_ = fVar119 * auVar128._4_4_;
  auVar240._8_4_ = fVar119 * auVar128._8_4_;
  auVar240._12_4_ = fVar119 * auVar128._12_4_;
  auVar156 = vinsertps_avx(auVar12,auVar62,0x10);
  auVar63 = vinsertps_avx(auVar10,auVar89,0x10);
  auVar235._0_4_ = (auVar156._0_4_ + auVar63._0_4_) * 0.5;
  auVar235._4_4_ = (auVar156._4_4_ + auVar63._4_4_) * 0.5;
  auVar235._8_4_ = (auVar156._8_4_ + auVar63._8_4_) * 0.5;
  auVar235._12_4_ = (auVar156._12_4_ + auVar63._12_4_) * 0.5;
  auVar78._4_4_ = auVar235._0_4_;
  auVar78._0_4_ = auVar235._0_4_;
  auVar78._8_4_ = auVar235._0_4_;
  auVar78._12_4_ = auVar235._0_4_;
  auVar128 = vfmadd213ps_fma(local_1e8,auVar78,local_4e8);
  auVar11 = vfmadd213ps_fma(local_1f8,auVar78,local_4f8);
  auVar239 = vfmadd213ps_fma(local_208,auVar78,local_508);
  auVar10 = vsubps_avx(auVar11,auVar128);
  auVar128 = vfmadd213ps_fma(auVar10,auVar78,auVar128);
  auVar10 = vsubps_avx(auVar239,auVar11);
  auVar10 = vfmadd213ps_fma(auVar10,auVar78,auVar11);
  auVar10 = vsubps_avx(auVar10,auVar128);
  auVar128 = vfmadd231ps_fma(auVar128,auVar10,auVar78);
  auVar79._0_8_ = CONCAT44(auVar10._4_4_ * 3.0,auVar10._0_4_ * 3.0);
  auVar79._8_4_ = auVar10._8_4_ * 3.0;
  auVar79._12_4_ = auVar10._12_4_ * 3.0;
  auVar259._8_8_ = auVar128._0_8_;
  auVar259._0_8_ = auVar128._0_8_;
  auVar10 = vshufpd_avx(auVar128,auVar128,3);
  auVar128 = vshufps_avx(auVar235,auVar235,0x55);
  auVar107 = vsubps_avx(auVar10,auVar259);
  auVar125 = vfmadd231ps_fma(auVar259,auVar128,auVar107);
  auVar265._8_8_ = auVar79._0_8_;
  auVar265._0_8_ = auVar79._0_8_;
  auVar10 = vshufpd_avx(auVar79,auVar79,3);
  auVar10 = vsubps_avx(auVar10,auVar265);
  auVar90 = vfmadd213ps_fma(auVar10,auVar128,auVar265);
  auVar128 = vmovshdup_avx(auVar90);
  auVar266._0_8_ = auVar128._0_8_ ^ 0x8000000080000000;
  auVar266._8_4_ = auVar128._8_4_ ^ 0x80000000;
  auVar266._12_4_ = auVar128._12_4_ ^ 0x80000000;
  auVar11 = vmovshdup_avx(auVar107);
  auVar10 = vunpcklps_avx(auVar11,auVar266);
  auVar239 = vshufps_avx(auVar10,auVar266,4);
  auVar233 = vshufps_avx(auVar235,auVar235,0x54);
  auVar130._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
  auVar130._8_4_ = auVar107._8_4_ ^ 0x80000000;
  auVar130._12_4_ = auVar107._12_4_ ^ 0x80000000;
  auVar10 = vmovlhps_avx(auVar130,auVar90);
  auVar10 = vshufps_avx(auVar10,auVar90,8);
  auVar128 = vfmsub231ss_fma(ZEXT416((uint)(auVar107._0_4_ * auVar128._0_4_)),auVar11,auVar90);
  uVar57 = auVar128._0_4_;
  auVar80._4_4_ = uVar57;
  auVar80._0_4_ = uVar57;
  auVar80._8_4_ = uVar57;
  auVar80._12_4_ = uVar57;
  auVar128 = vdivps_avx(auVar239,auVar80);
  auVar11 = vdivps_avx(auVar10,auVar80);
  fVar60 = auVar125._0_4_;
  fVar119 = auVar128._0_4_;
  auVar10 = vshufps_avx(auVar125,auVar125,0x55);
  fVar87 = auVar11._0_4_;
  auVar81._0_4_ = fVar60 * fVar119 + auVar10._0_4_ * fVar87;
  auVar81._4_4_ = fVar60 * auVar128._4_4_ + auVar10._4_4_ * auVar11._4_4_;
  auVar81._8_4_ = fVar60 * auVar128._8_4_ + auVar10._8_4_ * auVar11._8_4_;
  auVar81._12_4_ = fVar60 * auVar128._12_4_ + auVar10._12_4_ * auVar11._12_4_;
  auVar135 = vsubps_avx(auVar233,auVar81);
  auVar233 = vmovshdup_avx(auVar128);
  auVar10 = vinsertps_avx(auVar225,auVar250,0x1c);
  auVar157._0_4_ = auVar233._0_4_ * auVar10._0_4_;
  auVar157._4_4_ = auVar233._4_4_ * auVar10._4_4_;
  auVar157._8_4_ = auVar233._8_4_ * auVar10._8_4_;
  auVar157._12_4_ = auVar233._12_4_ * auVar10._12_4_;
  auVar239 = vinsertps_avx(auVar211,auVar240,0x1c);
  auVar98._0_4_ = auVar239._0_4_ * auVar233._0_4_;
  auVar98._4_4_ = auVar239._4_4_ * auVar233._4_4_;
  auVar98._8_4_ = auVar239._8_4_ * auVar233._8_4_;
  auVar98._12_4_ = auVar239._12_4_ * auVar233._12_4_;
  auVar125 = vminps_avx(auVar157,auVar98);
  auVar90 = vmaxps_avx(auVar98,auVar157);
  auVar233 = vinsertps_avx(auVar250,auVar225,0x4c);
  auVar91 = vmovshdup_avx(auVar11);
  auVar107 = vinsertps_avx(auVar240,auVar211,0x4c);
  auVar241._0_4_ = auVar91._0_4_ * auVar233._0_4_;
  auVar241._4_4_ = auVar91._4_4_ * auVar233._4_4_;
  auVar241._8_4_ = auVar91._8_4_ * auVar233._8_4_;
  auVar241._12_4_ = auVar91._12_4_ * auVar233._12_4_;
  auVar226._0_4_ = auVar91._0_4_ * auVar107._0_4_;
  auVar226._4_4_ = auVar91._4_4_ * auVar107._4_4_;
  auVar226._8_4_ = auVar91._8_4_ * auVar107._8_4_;
  auVar226._12_4_ = auVar91._12_4_ * auVar107._12_4_;
  auVar91 = vminps_avx(auVar241,auVar226);
  auVar251._0_4_ = auVar125._0_4_ + auVar91._0_4_;
  auVar251._4_4_ = auVar125._4_4_ + auVar91._4_4_;
  auVar251._8_4_ = auVar125._8_4_ + auVar91._8_4_;
  auVar251._12_4_ = auVar125._12_4_ + auVar91._12_4_;
  auVar125 = vmaxps_avx(auVar226,auVar241);
  auVar99._0_4_ = auVar125._0_4_ + auVar90._0_4_;
  auVar99._4_4_ = auVar125._4_4_ + auVar90._4_4_;
  auVar99._8_4_ = auVar125._8_4_ + auVar90._8_4_;
  auVar99._12_4_ = auVar125._12_4_ + auVar90._12_4_;
  auVar227._8_8_ = 0x3f80000000000000;
  auVar227._0_8_ = 0x3f80000000000000;
  auVar90 = vsubps_avx(auVar227,auVar99);
  auVar125 = vsubps_avx(auVar227,auVar251);
  auVar91 = vsubps_avx(auVar156,auVar235);
  auVar92 = vsubps_avx(auVar63,auVar235);
  auVar112._0_4_ = fVar119 * auVar10._0_4_;
  auVar112._4_4_ = fVar119 * auVar10._4_4_;
  auVar112._8_4_ = fVar119 * auVar10._8_4_;
  auVar112._12_4_ = fVar119 * auVar10._12_4_;
  auVar252._0_4_ = fVar119 * auVar239._0_4_;
  auVar252._4_4_ = fVar119 * auVar239._4_4_;
  auVar252._8_4_ = fVar119 * auVar239._8_4_;
  auVar252._12_4_ = fVar119 * auVar239._12_4_;
  auVar239 = vminps_avx(auVar112,auVar252);
  auVar10 = vmaxps_avx(auVar252,auVar112);
  auVar158._0_4_ = fVar87 * auVar233._0_4_;
  auVar158._4_4_ = fVar87 * auVar233._4_4_;
  auVar158._8_4_ = fVar87 * auVar233._8_4_;
  auVar158._12_4_ = fVar87 * auVar233._12_4_;
  auVar212._0_4_ = fVar87 * auVar107._0_4_;
  auVar212._4_4_ = fVar87 * auVar107._4_4_;
  auVar212._8_4_ = fVar87 * auVar107._8_4_;
  auVar212._12_4_ = fVar87 * auVar107._12_4_;
  auVar233 = vminps_avx(auVar158,auVar212);
  auVar253._0_4_ = auVar239._0_4_ + auVar233._0_4_;
  auVar253._4_4_ = auVar239._4_4_ + auVar233._4_4_;
  auVar253._8_4_ = auVar239._8_4_ + auVar233._8_4_;
  auVar253._12_4_ = auVar239._12_4_ + auVar233._12_4_;
  fVar118 = auVar91._0_4_;
  auVar260._0_4_ = fVar118 * auVar90._0_4_;
  fVar181 = auVar91._4_4_;
  auVar260._4_4_ = fVar181 * auVar90._4_4_;
  fVar196 = auVar91._8_4_;
  auVar260._8_4_ = fVar196 * auVar90._8_4_;
  fVar197 = auVar91._12_4_;
  auVar260._12_4_ = fVar197 * auVar90._12_4_;
  auVar239 = vmaxps_avx(auVar212,auVar158);
  auVar213._0_4_ = fVar118 * auVar125._0_4_;
  auVar213._4_4_ = fVar181 * auVar125._4_4_;
  auVar213._8_4_ = fVar196 * auVar125._8_4_;
  auVar213._12_4_ = fVar197 * auVar125._12_4_;
  fVar60 = auVar92._0_4_;
  auVar100._0_4_ = fVar60 * auVar90._0_4_;
  fVar61 = auVar92._4_4_;
  auVar100._4_4_ = fVar61 * auVar90._4_4_;
  fVar147 = auVar92._8_4_;
  auVar100._8_4_ = fVar147 * auVar90._8_4_;
  fVar218 = auVar92._12_4_;
  auVar100._12_4_ = fVar218 * auVar90._12_4_;
  auVar228._0_4_ = fVar60 * auVar125._0_4_;
  auVar228._4_4_ = fVar61 * auVar125._4_4_;
  auVar228._8_4_ = fVar147 * auVar125._8_4_;
  auVar228._12_4_ = fVar218 * auVar125._12_4_;
  auVar113._0_4_ = auVar10._0_4_ + auVar239._0_4_;
  auVar113._4_4_ = auVar10._4_4_ + auVar239._4_4_;
  auVar113._8_4_ = auVar10._8_4_ + auVar239._8_4_;
  auVar113._12_4_ = auVar10._12_4_ + auVar239._12_4_;
  auVar159._8_8_ = 0x3f800000;
  auVar159._0_8_ = 0x3f800000;
  auVar10 = vsubps_avx(auVar159,auVar113);
  auVar239 = vsubps_avx(auVar159,auVar253);
  auVar254._0_4_ = fVar118 * auVar10._0_4_;
  auVar254._4_4_ = fVar181 * auVar10._4_4_;
  auVar254._8_4_ = fVar196 * auVar10._8_4_;
  auVar254._12_4_ = fVar197 * auVar10._12_4_;
  auVar242._0_4_ = fVar118 * auVar239._0_4_;
  auVar242._4_4_ = fVar181 * auVar239._4_4_;
  auVar242._8_4_ = fVar196 * auVar239._8_4_;
  auVar242._12_4_ = fVar197 * auVar239._12_4_;
  auVar114._0_4_ = fVar60 * auVar10._0_4_;
  auVar114._4_4_ = fVar61 * auVar10._4_4_;
  auVar114._8_4_ = fVar147 * auVar10._8_4_;
  auVar114._12_4_ = fVar218 * auVar10._12_4_;
  auVar160._0_4_ = fVar60 * auVar239._0_4_;
  auVar160._4_4_ = fVar61 * auVar239._4_4_;
  auVar160._8_4_ = fVar147 * auVar239._8_4_;
  auVar160._12_4_ = fVar218 * auVar239._12_4_;
  auVar10 = vminps_avx(auVar254,auVar242);
  auVar239 = vminps_avx(auVar114,auVar160);
  auVar10 = vminps_avx(auVar10,auVar239);
  auVar239 = vmaxps_avx(auVar242,auVar254);
  auVar233 = vmaxps_avx(auVar160,auVar114);
  auVar107 = vminps_avx(auVar260,auVar213);
  auVar90 = vminps_avx(auVar100,auVar228);
  auVar107 = vminps_avx(auVar107,auVar90);
  auVar10 = vhaddps_avx(auVar10,auVar107);
  auVar239 = vmaxps_avx(auVar233,auVar239);
  auVar233 = vmaxps_avx(auVar213,auVar260);
  auVar107 = vmaxps_avx(auVar228,auVar100);
  auVar233 = vmaxps_avx(auVar107,auVar233);
  auVar239 = vhaddps_avx(auVar239,auVar233);
  auVar10 = vshufps_avx(auVar10,auVar10,0xe8);
  auVar239 = vshufps_avx(auVar239,auVar239,0xe8);
  auVar229._0_4_ = auVar135._0_4_ + auVar10._0_4_;
  auVar229._4_4_ = auVar135._4_4_ + auVar10._4_4_;
  auVar229._8_4_ = auVar135._8_4_ + auVar10._8_4_;
  auVar229._12_4_ = auVar135._12_4_ + auVar10._12_4_;
  auVar214._0_4_ = auVar135._0_4_ + auVar239._0_4_;
  auVar214._4_4_ = auVar135._4_4_ + auVar239._4_4_;
  auVar214._8_4_ = auVar135._8_4_ + auVar239._8_4_;
  auVar214._12_4_ = auVar135._12_4_ + auVar239._12_4_;
  auVar217 = ZEXT1664(auVar214);
  auVar10 = vmaxps_avx(auVar156,auVar229);
  auVar239 = vminps_avx(auVar214,auVar63);
  auVar10 = vcmpps_avx(auVar239,auVar10,1);
  auVar10 = vshufps_avx(auVar10,auVar10,0x50);
  if ((auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar10[0xf] < '\0')
  goto LAB_01130604;
  bVar51 = 0;
  if ((auVar195._0_4_ < auVar229._0_4_) && (bVar51 = 0, auVar214._0_4_ < auVar63._0_4_)) {
    auVar239 = vmovshdup_avx(auVar229);
    auVar10 = vcmpps_avx(auVar214,auVar63,1);
    bVar51 = auVar10[4] & auVar62._0_4_ < auVar239._0_4_;
  }
  auVar217 = ZEXT464(0x40400000);
  if (((3 < (uint)uVar53 || fVar59 < 0.001) | bVar51) != 1) goto LAB_011313dc;
  lVar50 = 0xc9;
  do {
    lVar50 = lVar50 + -1;
    if (lVar50 == 0) goto LAB_01130604;
    fVar61 = auVar135._0_4_;
    fVar60 = 1.0 - fVar61;
    fVar59 = fVar60 * fVar60 * fVar60;
    fVar86 = fVar61 * 3.0 * fVar60 * fVar60;
    fVar60 = fVar60 * fVar61 * fVar61 * 3.0;
    auVar142._4_4_ = fVar59;
    auVar142._0_4_ = fVar59;
    auVar142._8_4_ = fVar59;
    auVar142._12_4_ = fVar59;
    auVar115._4_4_ = fVar86;
    auVar115._0_4_ = fVar86;
    auVar115._8_4_ = fVar86;
    auVar115._12_4_ = fVar86;
    auVar101._4_4_ = fVar60;
    auVar101._0_4_ = fVar60;
    auVar101._8_4_ = fVar60;
    auVar101._12_4_ = fVar60;
    fVar61 = fVar61 * fVar61 * fVar61;
    auVar161._0_4_ = (float)local_218._0_4_ * fVar61;
    auVar161._4_4_ = (float)local_218._4_4_ * fVar61;
    auVar161._8_4_ = fStack_210 * fVar61;
    auVar161._12_4_ = fStack_20c * fVar61;
    auVar12 = vfmadd231ps_fma(auVar161,local_508,auVar101);
    auVar12 = vfmadd231ps_fma(auVar12,local_4f8,auVar115);
    auVar12 = vfmadd231ps_fma(auVar12,local_4e8,auVar142);
    auVar102._8_8_ = auVar12._0_8_;
    auVar102._0_8_ = auVar12._0_8_;
    auVar12 = vshufpd_avx(auVar12,auVar12,3);
    auVar10 = vshufps_avx(auVar135,auVar135,0x55);
    auVar12 = vsubps_avx(auVar12,auVar102);
    auVar10 = vfmadd213ps_fma(auVar12,auVar10,auVar102);
    fVar59 = auVar10._0_4_;
    auVar12 = vshufps_avx(auVar10,auVar10,0x55);
    auVar103._0_4_ = fVar119 * fVar59 + fVar87 * auVar12._0_4_;
    auVar103._4_4_ = auVar128._4_4_ * fVar59 + auVar11._4_4_ * auVar12._4_4_;
    auVar103._8_4_ = auVar128._8_4_ * fVar59 + auVar11._8_4_ * auVar12._8_4_;
    auVar103._12_4_ = auVar128._12_4_ * fVar59 + auVar11._12_4_ * auVar12._12_4_;
    auVar135 = vsubps_avx(auVar135,auVar103);
    auVar12 = vandps_avx(local_318,auVar10);
    auVar10 = vshufps_avx(auVar12,auVar12,0xf5);
    auVar12 = vmaxss_avx(auVar10,auVar12);
  } while ((float)local_228._0_4_ <= auVar12._0_4_);
  fVar59 = auVar135._0_4_;
  if ((fVar59 < 0.0) || (1.0 < fVar59)) goto LAB_01130604;
  auVar12 = vmovshdup_avx(auVar135);
  fVar86 = auVar12._0_4_;
  if ((fVar86 < 0.0) || (1.0 < fVar86)) goto LAB_01130604;
  auVar12 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                          ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),0x1c);
  auVar233 = vinsertps_avx(auVar12,ZEXT416((uint)(pre->ray_space).vz.field_0.m128[2]),0x28);
  aVar2 = (ray->org).field_0;
  auVar12 = vsubps_avx(local_458,(undefined1  [16])aVar2);
  auVar12 = vdpps_avx(auVar12,auVar233,0x7f);
  auVar10 = vsubps_avx(local_488,(undefined1  [16])aVar2);
  auVar10 = vdpps_avx(auVar10,auVar233,0x7f);
  auVar128 = vsubps_avx(local_498,(undefined1  [16])aVar2);
  auVar128 = vdpps_avx(auVar128,auVar233,0x7f);
  auVar11 = vsubps_avx(local_478,(undefined1  [16])aVar2);
  auVar11 = vdpps_avx(auVar11,auVar233,0x7f);
  auVar239 = vsubps_avx(_local_468,(undefined1  [16])aVar2);
  auVar239 = vdpps_avx(auVar239,auVar233,0x7f);
  auVar156 = vsubps_avx(_local_4a8,(undefined1  [16])aVar2);
  auVar156 = vdpps_avx(auVar156,auVar233,0x7f);
  auVar63 = vsubps_avx(_local_4b8,(undefined1  [16])aVar2);
  auVar63 = vdpps_avx(auVar63,auVar233,0x7f);
  auVar44._4_4_ = fStack_4c4;
  auVar44._0_4_ = local_4c8;
  auVar44._8_4_ = fStack_4c0;
  auVar44._12_4_ = fStack_4bc;
  auVar107 = vsubps_avx(auVar44,(undefined1  [16])aVar2);
  auVar233 = vdpps_avx(auVar107,auVar233,0x7f);
  fVar119 = 1.0 - fVar86;
  auVar12 = vfmadd231ss_fma(ZEXT416((uint)(auVar239._0_4_ * fVar86)),ZEXT416((uint)fVar119),auVar12)
  ;
  auVar10 = vfmadd231ss_fma(ZEXT416((uint)(auVar156._0_4_ * fVar86)),ZEXT416((uint)fVar119),auVar10)
  ;
  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar63._0_4_ * fVar86)),ZEXT416((uint)fVar119),auVar128
                            );
  auVar217 = ZEXT1664(auVar128);
  auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar86 * auVar233._0_4_)),ZEXT416((uint)fVar119),auVar11)
  ;
  fVar60 = 1.0 - fVar59;
  fVar86 = fVar60 * fVar59 * fVar59 * 3.0;
  fVar147 = fVar59 * fVar59 * fVar59;
  auVar128 = vfmadd231ss_fma(ZEXT416((uint)(auVar11._0_4_ * fVar147)),ZEXT416((uint)fVar86),auVar128
                            );
  fVar119 = fVar59 * 3.0 * fVar60 * fVar60;
  auVar10 = vfmadd231ss_fma(auVar128,ZEXT416((uint)fVar119),auVar10);
  fVar87 = fVar60 * fVar60 * fVar60;
  auVar12 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar87),auVar12);
  fVar61 = auVar12._0_4_;
  if ((fVar61 < (ray->org).field_0.m128[3]) || (ray->tfar < fVar61)) goto LAB_01130604;
  pGVar5 = (context->scene->geometries).items[local_4d0].ptr;
  if ((pGVar5->mask & ray->mask) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar51 = 1, pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_01131381;
    local_528._0_4_ = ray->tfar;
    auVar12 = vshufps_avx(auVar135,auVar135,0x55);
    auVar202._8_4_ = 0x3f800000;
    auVar202._0_8_ = 0x3f8000003f800000;
    auVar202._12_4_ = 0x3f800000;
    auVar10 = vsubps_avx(auVar202,auVar12);
    fVar218 = auVar12._0_4_;
    auVar215._0_4_ = fVar218 * (float)local_468._0_4_;
    fVar118 = auVar12._4_4_;
    auVar215._4_4_ = fVar118 * (float)local_468._4_4_;
    fVar181 = auVar12._8_4_;
    auVar215._8_4_ = fVar181 * fStack_460;
    fVar196 = auVar12._12_4_;
    auVar215._12_4_ = fVar196 * fStack_45c;
    auVar230._0_4_ = fVar218 * (float)local_4a8._0_4_;
    auVar230._4_4_ = fVar118 * (float)local_4a8._4_4_;
    auVar230._8_4_ = fVar181 * fStack_4a0;
    auVar230._12_4_ = fVar196 * fStack_49c;
    auVar236._0_4_ = fVar218 * (float)local_4b8._0_4_;
    auVar236._4_4_ = fVar118 * (float)local_4b8._4_4_;
    auVar236._8_4_ = fVar181 * fStack_4b0;
    auVar236._12_4_ = fVar196 * fStack_4ac;
    auVar190._0_4_ = fVar218 * local_4c8;
    auVar190._4_4_ = fVar118 * fStack_4c4;
    auVar190._8_4_ = fVar181 * fStack_4c0;
    auVar190._12_4_ = fVar196 * fStack_4bc;
    auVar12 = vfmadd231ps_fma(auVar215,auVar10,local_458);
    auVar128 = vfmadd231ps_fma(auVar230,auVar10,local_488);
    auVar11 = vfmadd231ps_fma(auVar236,auVar10,local_498);
    auVar239 = vfmadd231ps_fma(auVar190,auVar10,local_478);
    auVar12 = vsubps_avx(auVar128,auVar12);
    auVar10 = vsubps_avx(auVar11,auVar128);
    auVar217 = ZEXT1664(auVar10);
    auVar128 = vsubps_avx(auVar239,auVar11);
    auVar237._0_4_ = fVar59 * auVar10._0_4_;
    auVar237._4_4_ = fVar59 * auVar10._4_4_;
    auVar237._8_4_ = fVar59 * auVar10._8_4_;
    auVar237._12_4_ = fVar59 * auVar10._12_4_;
    auVar179._4_4_ = fVar60;
    auVar179._0_4_ = fVar60;
    auVar179._8_4_ = fVar60;
    auVar179._12_4_ = fVar60;
    auVar12 = vfmadd231ps_fma(auVar237,auVar179,auVar12);
    auVar191._0_4_ = fVar59 * auVar128._0_4_;
    auVar191._4_4_ = fVar59 * auVar128._4_4_;
    auVar191._8_4_ = fVar59 * auVar128._8_4_;
    auVar191._12_4_ = fVar59 * auVar128._12_4_;
    auVar128 = vfmadd231ps_fma(auVar191,auVar179,auVar10);
    auVar192._0_4_ = fVar59 * auVar128._0_4_;
    auVar192._4_4_ = fVar59 * auVar128._4_4_;
    auVar192._8_4_ = fVar59 * auVar128._8_4_;
    auVar192._12_4_ = fVar59 * auVar128._12_4_;
    auVar128 = vfmadd231ps_fma(auVar192,auVar179,auVar12);
    auVar162._0_4_ = fVar147 * (float)local_288._0_4_;
    auVar162._4_4_ = fVar147 * (float)local_288._4_4_;
    auVar162._8_4_ = fVar147 * fStack_280;
    auVar162._12_4_ = fVar147 * fStack_27c;
    auVar116._4_4_ = fVar86;
    auVar116._0_4_ = fVar86;
    auVar116._8_4_ = fVar86;
    auVar116._12_4_ = fVar86;
    auVar12 = vfmadd132ps_fma(auVar116,auVar162,local_278);
    auVar143._4_4_ = fVar119;
    auVar143._0_4_ = fVar119;
    auVar143._8_4_ = fVar119;
    auVar143._12_4_ = fVar119;
    auVar12 = vfmadd132ps_fma(auVar143,auVar12,local_268);
    auVar117._0_4_ = auVar128._0_4_ * 3.0;
    auVar117._4_4_ = auVar128._4_4_ * 3.0;
    auVar117._8_4_ = auVar128._8_4_ * 3.0;
    auVar117._12_4_ = auVar128._12_4_ * 3.0;
    auVar131._4_4_ = fVar87;
    auVar131._0_4_ = fVar87;
    auVar131._8_4_ = fVar87;
    auVar131._12_4_ = fVar87;
    auVar128 = vfmadd132ps_fma(auVar131,auVar12,local_258);
    auVar12 = vshufps_avx(auVar117,auVar117,0xc9);
    auVar144._0_4_ = auVar128._0_4_ * auVar12._0_4_;
    auVar144._4_4_ = auVar128._4_4_ * auVar12._4_4_;
    auVar144._8_4_ = auVar128._8_4_ * auVar12._8_4_;
    auVar144._12_4_ = auVar128._12_4_ * auVar12._12_4_;
    auVar12 = vshufps_avx(auVar128,auVar128,0xc9);
    auVar128 = vfmsub231ps_fma(auVar144,auVar117,auVar12);
    auVar12 = vshufps_avx(auVar128,auVar128,0xe9);
    local_2d8 = vmovlps_avx(auVar12);
    local_2d0 = auVar128._0_4_;
    local_2cc = vmovlps_avx(auVar135);
    local_2c4 = (int)local_3a8;
    local_2c0 = (int)local_4d0;
    local_2bc = context->user->instID[0];
    local_2b8 = context->user->instPrimID[0];
    ray->tfar = fVar61;
    local_52c = -1;
    local_358.valid = &local_52c;
    local_358.geometryUserPtr = pGVar5->userPtr;
    local_358.context = context->user;
    local_358.hit = (RTCHitN *)&local_2d8;
    local_358.N = 1;
    local_358.ray = (RTCRayN *)ray;
    if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0113132a:
      p_Var6 = context->args->filter;
      if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
        auVar217 = ZEXT1664(auVar217._0_16_);
        (*p_Var6)(&local_358);
        if (*local_358.valid == 0) goto LAB_01131373;
      }
      bVar51 = 1;
      goto LAB_01131381;
    }
    auVar217 = ZEXT1664(auVar10);
    (*pGVar5->occlusionFilterN)(&local_358);
    if (*local_358.valid != 0) goto LAB_0113132a;
LAB_01131373:
    ray->tfar = (float)local_528._0_4_;
  }
  bVar51 = 0;
LAB_01131381:
  bVar58 = (bool)(bVar58 | bVar51);
  goto LAB_01130604;
LAB_011313dc:
  local_238 = vinsertps_avx(auVar12,ZEXT416((uint)fVar86),0x10);
  auVar70 = vinsertps_avx(auVar62,ZEXT416((uint)auVar89._0_4_),0x10);
  goto LAB_01130055;
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }